

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  optState_t *poVar1;
  BYTE **ppBVar2;
  uint *puVar3;
  BYTE *pInLimit;
  undefined8 *puVar4;
  U32 UVar5;
  ZSTD_match_t *pZVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  ZSTD_optimal_t *pZVar9;
  U32 i;
  U32 UVar10;
  U32 UVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  U32 UVar16;
  U32 UVar17;
  U32 UVar18;
  U32 UVar19;
  U32 UVar20;
  U32 UVar21;
  U32 UVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  size_t sVar28;
  uint *puVar29;
  uint *puVar30;
  uint *puVar31;
  uint *puVar32;
  long lVar33;
  ZSTD_optimal_t *pZVar34;
  uint *puVar35;
  optState_t *poVar36;
  uint *puVar37;
  ulong uVar38;
  ulong uVar39;
  U32 *pUVar40;
  ZSTD_optimal_t *pZVar41;
  ulong uVar42;
  uint *puVar43;
  U32 *pUVar44;
  ulong uVar45;
  int extraout_EDX;
  int bonus;
  int bonus_00;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *puVar46;
  uint *extraout_RDX_03;
  uint uVar47;
  uint uVar48;
  BYTE *base;
  uint uVar49;
  ulong uVar50;
  uint *puVar51;
  seqStore_t *psVar52;
  int iVar53;
  uint uVar54;
  ulong uVar55;
  byte bVar56;
  uint *puVar57;
  BYTE *base_1;
  BYTE *pBVar58;
  void *pvVar59;
  BYTE *__s1;
  BYTE *base_3;
  BYTE *pBVar60;
  ulong uVar61;
  bool bVar62;
  repcodes_t rVar63;
  optState_t *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  U32 *local_190;
  uint *local_188;
  uint *local_178;
  U32 *local_170;
  uint *local_138;
  U32 *local_130;
  optState_t *local_128;
  uint *local_120;
  U32 nextToUpdate3_1;
  BYTE *local_110;
  U32 *local_108;
  optState_t *local_100;
  U32 *local_f8;
  uint *local_f0;
  ZSTD_optimal_t *local_e8;
  U32 *local_e0;
  seqStore_t *local_d8;
  BYTE *local_d0;
  U32 local_c8 [3];
  uint *local_b8;
  ulong local_b0;
  ZSTD_optimal_t *local_a8;
  uint local_9c;
  U32 *local_98;
  uint *local_90;
  U32 (*local_88) [3];
  uint *local_80;
  ulong local_78;
  U32 *local_70;
  U32 *local_68;
  U32 *local_60;
  uint *local_58;
  int local_50;
  U32 nextToUpdate3;
  undefined8 local_48;
  U32 local_40;
  ulong local_38;
  
  local_110 = (BYTE *)srcSize;
  local_88 = (U32 (*) [3])rep;
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a30,
                  "size_t ZSTD_compressBlock_btultra2(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  pBVar60 = (ms->window).base;
  local_38 = 4;
  puVar57 = (uint *)src;
  local_d8 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (UVar16 = (ms->window).dictLimit, UVar16 == (ms->window).lowLimit)) && (0x400 < srcSize)) {
    UVar10 = (U32)((long)src - (long)pBVar60);
    if (UVar16 == UVar10) {
      local_c8 = *(U32 (*) [3])rep;
      nextToUpdate3 = ms->nextToUpdate;
      if (1 < UVar10 - nextToUpdate3) {
        __assert_fail("ms->window.dictLimit - ms->nextToUpdate <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4a0a,
                      "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                     );
      }
      poVar1 = &ms->opt;
      uVar27 = (ms->cParams).targetLength;
      if (0xffe < uVar27) {
        uVar27 = 0xfff;
      }
      local_78 = CONCAT44(local_78._4_4_,uVar27);
      puVar3 = (uint *)((long)src + srcSize);
      local_80 = (uint *)((long)src + (srcSize - 8));
      uVar27 = (uint)((ms->cParams).minMatch == 3);
      uVar42 = (ulong)(4 - uVar27);
      pZVar6 = (ms->opt).matchTable;
      pZVar34 = (ms->opt).priceTable;
      ZSTD_rescaleFreqs(poVar1,(BYTE *)src,srcSize,2);
      local_178 = (uint *)((ulong)(pBVar60 + ((long)src - (long)pBVar60 & 0xffffffff) == (BYTE *)src
                                  ) + (long)src);
      local_f0 = (uint *)(ulong)(uVar27 ^ 3);
      local_e8 = pZVar34 + 1;
      local_60 = pZVar34[1].rep;
      local_58 = (uint *)src;
      local_a8 = pZVar34;
      local_90 = (uint *)((long)src + (srcSize - 0x20));
      puVar51 = extraout_RDX;
LAB_00119edc:
      local_b8 = (uint *)src;
      psVar52 = local_d8;
LAB_00119ef1:
      iVar53 = (int)puVar51;
      if (local_178 < local_80) {
        pBVar60 = (ms->window).base;
        uVar39 = (ulong)ms->nextToUpdate;
        if (local_178 < pBVar60 + uVar39) goto LAB_0011b195;
        iVar53 = (int)local_178;
        UVar10 = iVar53 - (int)src;
        UVar16 = (ms->cParams).minMatch;
        while( true ) {
          uVar27 = (uint)uVar39;
          uVar12 = (uint)((long)local_178 - (long)pBVar60);
          if (uVar12 <= uVar27) break;
          UVar11 = ZSTD_insertBt1(ms,pBVar60 + uVar39,(BYTE *)puVar3,UVar16,0);
          uVar39 = (ulong)(UVar11 + uVar27);
          psVar52 = local_d8;
          if (UVar11 + uVar27 <= uVar27) goto LAB_0011fd3f;
        }
        if ((ulong)((long)local_178 - (long)pBVar60) >> 0x20 == 0) {
          if ((ulong)((long)puVar3 - (long)pBVar60) >> 0x20 == 0) {
            ms->nextToUpdate = uVar12;
            if (UVar16 - 6 < 2) {
              uVar39 = (ulong)(UVar10 == 0);
              uVar27 = (ms->cParams).targetLength;
              if (0xffe < uVar27) {
                uVar27 = 0xfff;
              }
              pBVar60 = (ms->window).base;
              uVar47 = iVar53 - (int)pBVar60;
              local_e0 = (U32 *)((ulong)(*(long *)local_178 * -0x30e4432340650000) >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar12 = uVar47 - uVar54;
              if (uVar47 < uVar54) {
                uVar12 = 0;
              }
              uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar13 = (ms->window).lowLimit;
              uVar15 = uVar47 - uVar14;
              if (uVar47 - uVar13 <= uVar14) {
                uVar15 = uVar13;
              }
              pUVar44 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar15 = uVar13;
              }
              uVar55 = (ulong)((uVar54 & uVar47) * 2);
              local_d0 = (BYTE *)CONCAT44(local_d0._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f)
                                         );
              local_170 = pUVar44 + uVar55;
              local_1b8 = pUVar44 + uVar55 + 1;
              uVar48 = local_c8[0] - 1;
              uVar13 = (ms->window).dictLimit;
              local_108 = ms->hashTable;
              uVar14 = local_108[(long)local_e0];
              local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar47 + 8);
              uVar49 = uVar47 + 9;
              uVar55 = uVar39 + 3;
              local_100 = (optState_t *)(local_178 + 1);
              puVar51 = (uint *)0x0;
              puVar57 = local_f0;
              for (; uVar39 < uVar55; uVar39 = uVar39 + 1) {
                uVar26 = uVar48;
                if (uVar39 != 3) {
                  uVar26 = local_c8[uVar39];
                }
                if (uVar47 < uVar13) goto LAB_0011fd5e;
                if (uVar26 - 1 < uVar47 - uVar13) {
                  if (*local_178 != *(uint *)((long)local_178 - (ulong)uVar26)) goto LAB_0011a41b;
                  sVar28 = ZSTD_count((BYTE *)local_100,(BYTE *)((long)local_100 - (ulong)uVar26),
                                      (BYTE *)puVar3);
                  puVar35 = (uint *)(ulong)((int)sVar28 + 4);
                  psVar52 = local_d8;
                }
                else {
                  if (uVar47 < uVar15) goto LAB_0011fd7d;
LAB_0011a41b:
                  puVar35 = (uint *)0x0;
                }
                puVar29 = puVar51;
                if (puVar57 < puVar35) {
                  pZVar6[(long)puVar51].off = (int)uVar39 - (uint)(UVar10 == 0);
                  pZVar6[(long)puVar51].len = (uint)puVar35;
                  puVar29 = (uint *)(ulong)((int)puVar51 + 1);
                  if ((uVar27 < (uint)puVar35) ||
                     (puVar57 = puVar35, (uint *)((long)local_178 + (long)puVar35) == puVar3))
                  goto LAB_0011b173;
                }
                puVar51 = puVar29;
              }
              local_108[(long)local_e0] = uVar47;
              puVar35 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              puVar46 = puVar51;
              UVar16 = (U32)local_d0;
              while( true ) {
                bVar62 = UVar16 == 0;
                UVar16 = UVar16 - 1;
                pUVar40 = local_170;
                puVar51 = puVar35;
                puVar29 = puVar46;
                if ((bVar62) || (uVar14 < uVar15 + (uVar15 == 0))) break;
                puVar30 = puVar35;
                if (puVar37 < puVar35) {
                  puVar30 = puVar37;
                }
                if (uVar47 <= uVar14) goto LAB_0011fd9c;
                if ((long)puVar30 + (ulong)uVar14 < (ulong)uVar13) goto LAB_0011fdbb;
                pBVar58 = pBVar60 + uVar14;
                if ((uVar13 <= uVar14) &&
                   (iVar53 = bcmp(pBVar58,local_178,(size_t)puVar30), iVar53 != 0))
                goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)local_178 + (long)puVar30),
                                    pBVar58 + (long)puVar30,(BYTE *)puVar3);
                puVar30 = (uint *)(sVar28 + (long)puVar30);
                psVar52 = local_d8;
                if (puVar57 < puVar30) {
                  if (uVar49 < uVar14 || uVar49 - uVar14 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar49 - uVar14) < puVar30) {
                    uVar49 = (U32)puVar30 + uVar14;
                  }
                  pZVar6[(long)puVar46].off = (uVar47 + 2) - uVar14;
                  pZVar6[(long)puVar46].len = (U32)puVar30;
                  puVar29 = (uint *)(ulong)((int)puVar46 + 1);
                  puVar51 = puVar46;
                  if (((uint *)0x1000 < puVar30) ||
                     (puVar46 = puVar29, puVar57 = puVar30,
                     (uint *)((long)local_178 + (long)puVar30) == puVar3)) break;
                }
                puVar51 = pUVar44 + (uVar14 & uVar54) * 2;
                if (pBVar58[(long)puVar30] < *(byte *)((long)local_178 + (long)puVar30)) {
                  *local_170 = uVar14;
                  if (uVar14 <= uVar12) goto LAB_0011aefa;
                  puVar51 = puVar51 + 1;
                  puVar37 = puVar30;
                  local_170 = puVar51;
                }
                else {
                  *local_1b8 = uVar14;
                  local_1b8 = puVar51;
                  puVar35 = puVar30;
                  if (uVar14 <= uVar12) goto LAB_0011aee6;
                }
                uVar14 = *puVar51;
              }
              goto LAB_0011af0c;
            }
            if (UVar16 == 5) {
              uVar39 = (ulong)(UVar10 == 0);
              uVar27 = (ms->cParams).targetLength;
              if (0xffe < uVar27) {
                uVar27 = 0xfff;
              }
              pBVar60 = (ms->window).base;
              uVar54 = iVar53 - (int)pBVar60;
              local_e0 = (U32 *)((ulong)(*(long *)local_178 * -0x30e4432345000000) >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar12 = uVar54 - uVar47;
              if (uVar54 < uVar47) {
                uVar12 = 0;
              }
              uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar13 = (ms->window).lowLimit;
              uVar15 = uVar54 - uVar14;
              if (uVar54 - uVar13 <= uVar14) {
                uVar15 = uVar13;
              }
              pUVar44 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar15 = uVar13;
              }
              uVar55 = (ulong)((uVar47 & uVar54) * 2);
              local_d0 = (BYTE *)CONCAT44(local_d0._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f)
                                         );
              local_170 = pUVar44 + uVar55;
              local_1b8 = pUVar44 + uVar55 + 1;
              uVar48 = local_c8[0] - 1;
              uVar13 = (ms->window).dictLimit;
              local_108 = ms->hashTable;
              uVar14 = local_108[(long)local_e0];
              local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar54 + 8);
              uVar49 = uVar54 + 9;
              uVar55 = uVar39 + 3;
              local_100 = (optState_t *)(local_178 + 1);
              puVar51 = (uint *)0x0;
              puVar57 = local_f0;
              for (; uVar39 < uVar55; uVar39 = uVar39 + 1) {
                uVar26 = uVar48;
                if (uVar39 != 3) {
                  uVar26 = local_c8[uVar39];
                }
                if (uVar54 < uVar13) goto LAB_0011fd5e;
                if (uVar26 - 1 < uVar54 - uVar13) {
                  if (*local_178 != *(uint *)((long)local_178 - (ulong)uVar26)) goto LAB_0011a811;
                  sVar28 = ZSTD_count((BYTE *)local_100,(BYTE *)((long)local_100 - (ulong)uVar26),
                                      (BYTE *)puVar3);
                  puVar35 = (uint *)(ulong)((int)sVar28 + 4);
                  psVar52 = local_d8;
                }
                else {
                  if (uVar54 < uVar15) goto LAB_0011fd7d;
LAB_0011a811:
                  puVar35 = (uint *)0x0;
                }
                puVar29 = puVar51;
                if (puVar57 < puVar35) {
                  pZVar6[(long)puVar51].off = (int)uVar39 - (uint)(UVar10 == 0);
                  pZVar6[(long)puVar51].len = (uint)puVar35;
                  puVar29 = (uint *)(ulong)((int)puVar51 + 1);
                  if ((uVar27 < (uint)puVar35) ||
                     (puVar57 = puVar35, (uint *)((long)local_178 + (long)puVar35) == puVar3))
                  goto LAB_0011b173;
                }
                puVar51 = puVar29;
              }
              local_108[(long)local_e0] = uVar54;
              puVar35 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              puVar46 = puVar51;
              UVar16 = (U32)local_d0;
              while( true ) {
                bVar62 = UVar16 == 0;
                UVar16 = UVar16 - 1;
                pUVar40 = local_170;
                puVar51 = puVar35;
                puVar29 = puVar46;
                if ((bVar62) || (uVar14 < uVar15 + (uVar15 == 0))) break;
                puVar30 = puVar35;
                if (puVar37 < puVar35) {
                  puVar30 = puVar37;
                }
                if (uVar54 <= uVar14) goto LAB_0011fd9c;
                if ((long)puVar30 + (ulong)uVar14 < (ulong)uVar13) goto LAB_0011fdbb;
                pBVar58 = pBVar60 + uVar14;
                if ((uVar13 <= uVar14) &&
                   (iVar53 = bcmp(pBVar58,local_178,(size_t)puVar30), iVar53 != 0))
                goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)local_178 + (long)puVar30),
                                    pBVar58 + (long)puVar30,(BYTE *)puVar3);
                puVar30 = (uint *)(sVar28 + (long)puVar30);
                psVar52 = local_d8;
                if (puVar57 < puVar30) {
                  if (uVar49 < uVar14 || uVar49 - uVar14 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar49 - uVar14) < puVar30) {
                    uVar49 = (U32)puVar30 + uVar14;
                  }
                  pZVar6[(long)puVar46].off = (uVar54 + 2) - uVar14;
                  pZVar6[(long)puVar46].len = (U32)puVar30;
                  puVar29 = (uint *)(ulong)((int)puVar46 + 1);
                  puVar51 = puVar46;
                  if (((uint *)0x1000 < puVar30) ||
                     (puVar46 = puVar29, puVar57 = puVar30,
                     (uint *)((long)local_178 + (long)puVar30) == puVar3)) break;
                }
                puVar51 = pUVar44 + (uVar14 & uVar47) * 2;
                if (pBVar58[(long)puVar30] < *(byte *)((long)local_178 + (long)puVar30)) {
                  *local_170 = uVar14;
                  if (uVar14 <= uVar12) goto LAB_0011aefa;
                  puVar51 = puVar51 + 1;
                  puVar37 = puVar30;
                  local_170 = puVar51;
                }
                else {
                  *local_1b8 = uVar14;
                  local_1b8 = puVar51;
                  puVar35 = puVar30;
                  if (uVar14 <= uVar12) goto LAB_0011aee6;
                }
                uVar14 = *puVar51;
              }
              goto LAB_0011af0c;
            }
            if (UVar16 != 3) {
              uVar39 = (ulong)(UVar10 == 0);
              uVar27 = (ms->cParams).targetLength;
              if (0xffe < uVar27) {
                uVar27 = 0xfff;
              }
              pBVar60 = (ms->window).base;
              uVar54 = iVar53 - (int)pBVar60;
              local_e0 = (U32 *)(ulong)(*local_178 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar12 = uVar54 - uVar47;
              if (uVar54 < uVar47) {
                uVar12 = 0;
              }
              uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              uVar13 = (ms->window).lowLimit;
              uVar15 = uVar54 - uVar14;
              if (uVar54 - uVar13 <= uVar14) {
                uVar15 = uVar13;
              }
              pUVar44 = ms->chainTable;
              if (ms->loadedDictEnd != 0) {
                uVar15 = uVar13;
              }
              uVar55 = (ulong)((uVar47 & uVar54) * 2);
              local_d0 = (BYTE *)CONCAT44(local_d0._4_4_,1 << ((byte)(ms->cParams).searchLog & 0x1f)
                                         );
              local_170 = pUVar44 + uVar55;
              local_1b8 = pUVar44 + uVar55 + 1;
              uVar48 = local_c8[0] - 1;
              uVar13 = (ms->window).dictLimit;
              local_108 = ms->hashTable;
              uVar14 = local_108[(long)local_e0];
              local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar54 + 8);
              uVar49 = uVar54 + 9;
              uVar55 = uVar39 + 3;
              local_100 = (optState_t *)(local_178 + 1);
              puVar51 = (uint *)0x0;
              puVar57 = local_f0;
              for (; uVar39 < uVar55; uVar39 = uVar39 + 1) {
                uVar26 = uVar48;
                if (uVar39 != 3) {
                  uVar26 = local_c8[uVar39];
                }
                if (uVar54 < uVar13) goto LAB_0011fd5e;
                if (uVar26 - 1 < uVar54 - uVar13) {
                  if (*local_178 != *(uint *)((long)local_178 - (ulong)uVar26)) goto LAB_0011aa4b;
                  sVar28 = ZSTD_count((BYTE *)local_100,(BYTE *)((long)local_100 - (ulong)uVar26),
                                      (BYTE *)puVar3);
                  puVar35 = (uint *)(ulong)((int)sVar28 + 4);
                  psVar52 = local_d8;
                }
                else {
                  if (uVar54 < uVar15) goto LAB_0011fd7d;
LAB_0011aa4b:
                  puVar35 = (uint *)0x0;
                }
                puVar29 = puVar51;
                if (puVar57 < puVar35) {
                  pZVar6[(long)puVar51].off = (int)uVar39 - (uint)(UVar10 == 0);
                  pZVar6[(long)puVar51].len = (uint)puVar35;
                  puVar29 = (uint *)(ulong)((int)puVar51 + 1);
                  if ((uVar27 < (uint)puVar35) ||
                     (puVar57 = puVar35, (uint *)((long)local_178 + (long)puVar35) == puVar3))
                  goto LAB_0011b173;
                }
                puVar51 = puVar29;
              }
              local_108[(long)local_e0] = uVar54;
              puVar35 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              puVar46 = puVar51;
              UVar16 = (U32)local_d0;
              while( true ) {
                bVar62 = UVar16 == 0;
                UVar16 = UVar16 - 1;
                pUVar40 = local_170;
                puVar51 = puVar35;
                puVar29 = puVar46;
                if ((bVar62) || (uVar14 < uVar15 + (uVar15 == 0))) break;
                puVar30 = puVar35;
                if (puVar37 < puVar35) {
                  puVar30 = puVar37;
                }
                if (uVar54 <= uVar14) goto LAB_0011fd9c;
                if ((long)puVar30 + (ulong)uVar14 < (ulong)uVar13) goto LAB_0011fdbb;
                pBVar58 = pBVar60 + uVar14;
                if ((uVar13 <= uVar14) &&
                   (iVar53 = bcmp(pBVar58,local_178,(size_t)puVar30), iVar53 != 0))
                goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)local_178 + (long)puVar30),
                                    pBVar58 + (long)puVar30,(BYTE *)puVar3);
                puVar30 = (uint *)(sVar28 + (long)puVar30);
                psVar52 = local_d8;
                if (puVar57 < puVar30) {
                  if (uVar49 < uVar14 || uVar49 - uVar14 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar49 - uVar14) < puVar30) {
                    uVar49 = (U32)puVar30 + uVar14;
                  }
                  pZVar6[(long)puVar46].off = (uVar54 + 2) - uVar14;
                  pZVar6[(long)puVar46].len = (U32)puVar30;
                  puVar29 = (uint *)(ulong)((int)puVar46 + 1);
                  puVar51 = puVar46;
                  if (((uint *)0x1000 < puVar30) ||
                     (puVar46 = puVar29, puVar57 = puVar30,
                     (uint *)((long)local_178 + (long)puVar30) == puVar3)) break;
                }
                puVar51 = pUVar44 + (uVar14 & uVar47) * 2;
                if (pBVar58[(long)puVar30] < *(byte *)((long)local_178 + (long)puVar30)) {
                  *local_170 = uVar14;
                  if (uVar14 <= uVar12) goto LAB_0011aefa;
                  puVar51 = puVar51 + 1;
                  puVar37 = puVar30;
                  local_170 = puVar51;
                }
                else {
                  *local_1b8 = uVar14;
                  local_1b8 = puVar51;
                  puVar35 = puVar30;
                  if (uVar14 <= uVar12) goto LAB_0011aee6;
                }
                uVar14 = *puVar51;
              }
              goto LAB_0011af0c;
            }
            uVar39 = (ulong)(UVar10 == 0);
            uVar27 = (ms->cParams).targetLength;
            if (0xffe < uVar27) {
              uVar27 = 0xfff;
            }
            pBVar60 = (ms->window).base;
            uVar47 = iVar53 - (int)pBVar60;
            local_e0 = (U32 *)(ulong)(*local_178 * -0x61c8864f >>
                                     (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar12 = uVar47 - uVar54;
            if (uVar47 < uVar54) {
              uVar12 = 0;
            }
            uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar16 = (ms->window).lowLimit;
            UVar11 = uVar47 - uVar13;
            if (uVar47 - UVar16 <= uVar13) {
              UVar11 = UVar16;
            }
            puVar57 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar11 = UVar16;
            }
            uVar14 = UVar11 + (UVar11 == 0);
            uVar45 = (ulong)((uVar54 & uVar47) * 2);
            iVar53 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_190 = puVar57 + uVar45;
            uVar49 = local_c8[0] - 1;
            uVar13 = (ms->window).dictLimit;
            local_108 = ms->hashTable;
            local_d0 = (BYTE *)(ulong)local_108[(long)local_e0];
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar47 + 8);
            uVar15 = uVar47 + 9;
            uVar55 = uVar39 + 3;
            local_100 = (optState_t *)((long)local_178 + 3);
            puVar37 = puVar57;
            puVar35 = local_f0;
            puVar51 = (uint *)0x0;
            for (; uVar39 < uVar55; uVar39 = uVar39 + 1) {
              uVar48 = uVar49;
              if (uVar39 != 3) {
                uVar48 = local_c8[uVar39];
              }
              if (uVar47 < uVar13) goto LAB_0011fd5e;
              if (uVar48 - 1 < uVar47 - uVar13) {
                if (((*(uint *)((long)local_178 - (ulong)uVar48) ^ *local_178) & 0xffffff) != 0)
                goto LAB_0011a1d0;
                sVar28 = ZSTD_count((BYTE *)local_100,(BYTE *)((long)local_100 - (ulong)uVar48),
                                    (BYTE *)puVar3);
                puVar46 = (uint *)(ulong)((int)sVar28 + 3);
                puVar37 = extraout_RDX_00;
                psVar52 = local_d8;
              }
              else {
                if (uVar47 < UVar11) goto LAB_0011fd7d;
LAB_0011a1d0:
                puVar46 = (uint *)0x0;
              }
              puVar29 = puVar51;
              if (puVar35 < puVar46) {
                pZVar6[(long)puVar51].off = (int)uVar39 - (uint)(UVar10 == 0);
                pZVar6[(long)puVar51].len = (uint)puVar46;
                puVar29 = (uint *)(ulong)((int)puVar51 + 1);
                if ((uVar27 < (uint)puVar46) ||
                   (puVar35 = puVar46, puVar37 = puVar51,
                   (uint *)((long)local_178 + (long)puVar46) == puVar3)) goto LAB_0011b173;
              }
              puVar51 = puVar29;
            }
            if ((((puVar35 < (uint *)0x3) &&
                 (UVar16 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3,(BYTE *)local_178),
                 puVar37 = extraout_RDX_01, psVar52 = local_d8, uVar14 <= UVar16)) &&
                (uVar47 - UVar16 < 0x40000)) &&
               (puVar29 = (uint *)ZSTD_count((BYTE *)local_178,pBVar60 + UVar16,(BYTE *)puVar3),
               puVar37 = extraout_RDX_02, psVar52 = local_d8, (uint *)0x2 < puVar29)) {
              if (uVar47 <= UVar16) goto LAB_00120046;
              if ((int)puVar51 != 0) goto LAB_00120065;
              pZVar6->off = (uVar47 - UVar16) + 2;
              pZVar6->len = (U32)puVar29;
              puVar46 = (uint *)((long)puVar29 + (long)local_178);
              puVar37 = (uint *)CONCAT71((int7)((ulong)puVar46 >> 8),puVar46 != puVar3);
              puVar51 = (uint *)0x1;
              puVar35 = puVar29;
              if (puVar29 <= (uint *)(ulong)uVar27 && puVar46 != puVar3) goto LAB_0011af73;
              UVar16 = uVar47 + 1;
              puVar29 = (uint *)0x1;
            }
            else {
LAB_0011af73:
              local_108[(long)local_e0] = uVar47;
              puVar46 = (uint *)0x0;
              pBVar58 = local_d0;
              puVar30 = (uint *)0x0;
              local_188 = puVar57 + uVar45 + 1;
LAB_0011af95:
              bVar62 = iVar53 == 0;
              iVar53 = iVar53 + -1;
              puVar32 = local_190;
              puVar43 = local_188;
              puVar29 = puVar51;
              if ((bVar62) || (uVar27 = (uint)pBVar58, uVar27 < uVar14)) goto LAB_0011b14d;
              puVar31 = puVar30;
              if (puVar46 < puVar30) {
                puVar31 = puVar46;
              }
              if (uVar47 <= uVar27) goto LAB_0011fd9c;
              if ((long)puVar31 + ((ulong)pBVar58 & 0xffffffff) < (ulong)uVar13) goto LAB_0011fdbb;
              pBVar58 = pBVar60 + ((ulong)pBVar58 & 0xffffffff);
              if ((uVar13 <= uVar27) &&
                 (iVar24 = bcmp(pBVar58,local_178,(size_t)puVar31), iVar24 != 0)) goto LAB_0011fdda;
              sVar28 = ZSTD_count((BYTE *)((long)local_178 + (long)puVar31),pBVar58 + (long)puVar31,
                                  (BYTE *)puVar3);
              puVar31 = (uint *)(sVar28 + (long)puVar31);
              psVar52 = local_d8;
              if (puVar35 < puVar31) {
                if (uVar15 < uVar27 || uVar15 - uVar27 == 0) goto LAB_0011fdf9;
                if ((uint *)(ulong)(uVar15 - uVar27) < puVar31) {
                  uVar15 = uVar27 + (U32)puVar31;
                }
                pZVar6[(long)puVar51].off = (uVar47 + 2) - uVar27;
                pZVar6[(long)puVar51].len = (U32)puVar31;
                puVar29 = (uint *)(ulong)((int)puVar51 + 1);
                puVar37 = puVar51;
                if (((uint *)0x1000 < puVar31) ||
                   (puVar35 = puVar31, puVar51 = puVar29,
                   (uint *)((long)local_178 + (long)puVar31) == puVar3)) goto LAB_0011b14d;
              }
              puVar37 = puVar57 + (uVar27 & uVar54) * 2;
              puVar29 = puVar51;
              if (*(byte *)((long)local_178 + (long)puVar31) <= pBVar58[(long)puVar31]) {
                *local_188 = uVar27;
                puVar43 = puVar37;
                if (uVar27 <= uVar12) {
                  puVar43 = &nextToUpdate3_1;
                  puVar37 = local_188;
                  goto LAB_0011b14d;
                }
LAB_0011b114:
                pBVar58 = (BYTE *)(ulong)*puVar37;
                puVar37 = local_188;
                puVar30 = puVar31;
                local_188 = puVar43;
                goto LAB_0011af95;
              }
              *local_190 = uVar27;
              if (uVar12 < uVar27) {
                puVar37 = puVar37 + 1;
                local_188 = puVar37;
                puVar46 = puVar31;
                puVar31 = puVar30;
                local_190 = puVar37;
                goto LAB_0011b114;
              }
              puVar32 = &nextToUpdate3_1;
              puVar37 = local_190;
LAB_0011b14d:
              *puVar43 = 0;
              *puVar32 = 0;
              if (uVar15 <= (uint)local_f8) goto LAB_0011fe56;
              UVar16 = uVar15 - 8;
            }
            ms->nextToUpdate = UVar16;
            puVar51 = puVar37;
            goto LAB_0011b173;
          }
          goto LAB_0011fe37;
        }
        goto LAB_0011fe18;
      }
      psVar52->lit = psVar52->litStart;
      psVar52->sequences = psVar52->sequencesStart;
      psVar52->longLengthID = 0;
      ppBVar2 = &(ms->window).base;
      *ppBVar2 = *ppBVar2 + -(long)local_110;
      UVar16 = (ms->window).dictLimit + (int)local_110;
      (ms->window).dictLimit = UVar16;
      (ms->window).lowLimit = UVar16;
      ms->nextToUpdate = UVar16;
      if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
        UVar16 = ZSTD_upscaleStat((ms->opt).litFreq,0xff,iVar53);
        (ms->opt).litSum = UVar16;
        iVar53 = extraout_EDX;
      }
      UVar16 = ZSTD_upscaleStat((ms->opt).litLengthFreq,0x23,iVar53);
      (ms->opt).litLengthSum = UVar16;
      UVar16 = ZSTD_upscaleStat((ms->opt).matchLengthFreq,0x34,bonus);
      (ms->opt).matchLengthSum = UVar16;
      UVar16 = ZSTD_upscaleStat((ms->opt).offCodeFreq,0x1f,bonus_00);
      (ms->opt).offCodeSum = UVar16;
      pBVar60 = (ms->window).base;
    }
  }
  pBVar58 = local_110;
  local_100 = &ms->opt;
  uVar27 = (ms->window).dictLimit;
  uVar12 = (ms->cParams).targetLength;
  if (0xffe < uVar12) {
    uVar12 = 0xfff;
  }
  local_70 = (U32 *)CONCAT44(local_70._4_4_,uVar12);
  pInLimit = (BYTE *)((long)puVar57 + (long)local_110);
  puVar3 = (uint *)((long)(puVar57 + -2) + (long)local_110);
  uVar12 = (uint)((ms->cParams).minMatch == 3);
  local_38 = (ulong)((int)local_38 - uVar12);
  nextToUpdate3_1 = ms->nextToUpdate;
  local_e8 = (ZSTD_optimal_t *)(ms->opt).matchTable;
  pZVar34 = (ms->opt).priceTable;
  ZSTD_rescaleFreqs(local_100,(BYTE *)puVar57,(size_t)local_110,2);
  puVar51 = (uint *)((ulong)((uint *)(pBVar60 + uVar27) == puVar57) + (long)puVar57);
  local_80 = (uint *)(ulong)(uVar12 ^ 3);
  local_d0 = (BYTE *)((long)puVar57 + (long)pBVar58) + -0x20;
  local_a8 = pZVar34 + 1;
  local_98 = pZVar34[1].rep;
  local_58 = puVar57;
LAB_0011ced2:
  if (puVar3 <= puVar51) {
    return (long)pInLimit - (long)puVar57;
  }
  pBVar60 = (ms->window).base;
  uVar42 = (ulong)ms->nextToUpdate;
  if (puVar51 < pBVar60 + uVar42) goto LAB_0011e105;
  iVar53 = (int)puVar51;
  UVar10 = iVar53 - (int)puVar57;
  UVar16 = (ms->cParams).minMatch;
  while( true ) {
    uVar27 = (uint)uVar42;
    uVar12 = (uint)((long)puVar51 - (long)pBVar60);
    if (uVar12 <= uVar27) break;
    UVar11 = ZSTD_insertBt1(ms,pBVar60 + uVar42,pInLimit,UVar16,0);
    uVar42 = (ulong)(UVar11 + uVar27);
    if (UVar11 + uVar27 <= uVar27) {
LAB_0011fd3f:
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4786,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)puVar51 - (long)pBVar60) >> 0x20 != 0) {
LAB_0011fe18:
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4789,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)pInLimit - (long)pBVar60) >> 0x20 != 0) {
LAB_0011fe37:
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x478a,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar12;
  if (UVar16 - 6 < 2) {
    uVar42 = (ulong)(UVar10 == 0);
    uVar27 = (ms->cParams).targetLength;
    if (0xffe < uVar27) {
      uVar27 = 0xfff;
    }
    local_110 = (ms->window).base;
    uVar47 = iVar53 - (int)local_110;
    uVar39 = 0;
    uVar55 = (ulong)(*(long *)puVar51 * -0x30e4432340650000) >>
             (-(char)(ms->cParams).hashLog & 0x3fU);
    uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar12 = uVar47 - uVar54;
    if (uVar47 < uVar54) {
      uVar12 = 0;
    }
    uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar16 = (ms->window).lowLimit;
    UVar11 = uVar47 - uVar13;
    if (uVar47 - UVar16 <= uVar13) {
      UVar11 = UVar16;
    }
    pUVar44 = ms->chainTable;
    uVar13 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar16;
    }
    uVar45 = (ulong)((uVar54 & uVar47) * 2);
    local_1c0 = (optState_t *)(pUVar44 + uVar45);
    iVar53 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_1b0 = pUVar44 + uVar45 + 1;
    local_f0 = ms->hashTable;
    uVar15 = local_f0[uVar55];
    local_b8 = (uint *)CONCAT44(local_b8._4_4_,uVar47 + 8);
    uVar14 = uVar47 + 9;
    uVar45 = uVar42 + 3;
    puVar57 = local_80;
    for (; uVar42 < uVar45; uVar42 = uVar42 + 1) {
      if (uVar42 == 3) {
        uVar49 = (*local_88)[0] - 1;
      }
      else {
        uVar49 = (*local_88)[uVar42];
      }
      if (uVar47 < uVar13) goto LAB_0011fd5e;
      if (uVar49 - 1 < uVar47 - uVar13) {
        if (*puVar51 != *(uint *)((long)puVar51 - (ulong)uVar49)) goto LAB_0011d3da;
        sVar28 = ZSTD_count((BYTE *)(puVar51 + 1),(BYTE *)((long)(puVar51 + 1) - (ulong)uVar49),
                            pInLimit);
        uVar49 = (int)sVar28 + 4;
      }
      else {
        if (uVar47 < UVar11) goto LAB_0011fd7d;
LAB_0011d3da:
        uVar49 = 0;
      }
      puVar35 = (uint *)(ulong)uVar49;
      if (puVar57 < puVar35) {
        local_e8->rep[uVar39 * 2 + -4] = (int)uVar42 - (uint)(UVar10 == 0);
        local_e8->rep[uVar39 * 2 + -3] = uVar49;
        uVar39 = (ulong)((int)uVar39 + 1);
        if ((uVar27 < uVar49) ||
           (puVar57 = puVar35, (BYTE *)((long)puVar51 + (long)puVar35) == pInLimit))
        goto LAB_0011e0f3;
      }
    }
    local_f0[uVar55] = uVar47;
    puVar35 = (uint *)0x0;
    puVar29 = (uint *)0x0;
    while( true ) {
      bVar62 = iVar53 == 0;
      iVar53 = iVar53 + -1;
      if ((bVar62) || (uVar15 < UVar11 + (UVar11 == 0))) break;
      puVar37 = puVar35;
      if (puVar29 < puVar35) {
        puVar37 = puVar29;
      }
      if (uVar47 <= uVar15) goto LAB_0011fd9c;
      if ((long)puVar37 + (ulong)uVar15 < (ulong)uVar13) goto LAB_0011fdbb;
      pBVar60 = local_110 + uVar15;
      if ((uVar13 <= uVar15) && (iVar24 = bcmp(pBVar60,puVar51,(size_t)puVar37), iVar24 != 0))
      goto LAB_0011fdda;
      sVar28 = ZSTD_count((BYTE *)((long)puVar51 + (long)puVar37),pBVar60 + (long)puVar37,pInLimit);
      puVar37 = (uint *)(sVar28 + (long)puVar37);
      if (puVar57 < puVar37) {
        if (uVar14 < uVar15 || uVar14 - uVar15 == 0) goto LAB_0011fdf9;
        if ((uint *)(ulong)(uVar14 - uVar15) < puVar37) {
          uVar14 = uVar15 + (U32)puVar37;
        }
        local_e8->rep[uVar39 * 2 + -4] = (uVar47 + 2) - uVar15;
        local_e8->rep[uVar39 * 2 + -3] = (U32)puVar37;
        uVar39 = (ulong)((int)uVar39 + 1);
        if (((uint *)0x1000 < puVar37) ||
           (puVar57 = puVar37, (BYTE *)((long)puVar51 + (long)puVar37) == pInLimit)) break;
      }
      puVar46 = pUVar44 + (uVar15 & uVar54) * 2;
      if (pBVar60[(long)puVar37] < *(byte *)((long)puVar51 + (long)puVar37)) {
        *(uint *)local_1c0 = uVar15;
        if (uVar15 <= uVar12) goto LAB_0011de96;
        puVar46 = puVar46 + 1;
        puVar29 = puVar37;
        local_1c0 = (optState_t *)puVar46;
      }
      else {
        *local_1b0 = uVar15;
        local_1b0 = puVar46;
        puVar35 = puVar37;
        if (uVar15 <= uVar12) goto LAB_0011de83;
      }
      uVar15 = *puVar46;
    }
    goto LAB_0011dea7;
  }
  if (UVar16 == 5) {
    uVar42 = (ulong)(UVar10 == 0);
    uVar27 = (ms->cParams).targetLength;
    if (0xffe < uVar27) {
      uVar27 = 0xfff;
    }
    local_110 = (ms->window).base;
    uVar47 = iVar53 - (int)local_110;
    uVar39 = 0;
    uVar55 = (ulong)(*(long *)puVar51 * -0x30e4432345000000) >>
             (-(char)(ms->cParams).hashLog & 0x3fU);
    uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar12 = uVar47 - uVar54;
    if (uVar47 < uVar54) {
      uVar12 = 0;
    }
    uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar16 = (ms->window).lowLimit;
    UVar11 = uVar47 - uVar13;
    if (uVar47 - UVar16 <= uVar13) {
      UVar11 = UVar16;
    }
    pUVar44 = ms->chainTable;
    uVar13 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar16;
    }
    uVar45 = (ulong)((uVar54 & uVar47) * 2);
    local_1c0 = (optState_t *)(pUVar44 + uVar45);
    iVar53 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_1b0 = pUVar44 + uVar45 + 1;
    local_f0 = ms->hashTable;
    uVar15 = local_f0[uVar55];
    local_b8 = (uint *)CONCAT44(local_b8._4_4_,uVar47 + 8);
    uVar14 = uVar47 + 9;
    uVar45 = uVar42 + 3;
    puVar57 = local_80;
    for (; uVar42 < uVar45; uVar42 = uVar42 + 1) {
      if (uVar42 == 3) {
        uVar49 = (*local_88)[0] - 1;
      }
      else {
        uVar49 = (*local_88)[uVar42];
      }
      if (uVar47 < uVar13) goto LAB_0011fd5e;
      if (uVar49 - 1 < uVar47 - uVar13) {
        if (*puVar51 != *(uint *)((long)puVar51 - (ulong)uVar49)) goto LAB_0011d7c5;
        sVar28 = ZSTD_count((BYTE *)(puVar51 + 1),(BYTE *)((long)(puVar51 + 1) - (ulong)uVar49),
                            pInLimit);
        uVar49 = (int)sVar28 + 4;
      }
      else {
        if (uVar47 < UVar11) goto LAB_0011fd7d;
LAB_0011d7c5:
        uVar49 = 0;
      }
      puVar35 = (uint *)(ulong)uVar49;
      if (puVar57 < puVar35) {
        local_e8->rep[uVar39 * 2 + -4] = (int)uVar42 - (uint)(UVar10 == 0);
        local_e8->rep[uVar39 * 2 + -3] = uVar49;
        uVar39 = (ulong)((int)uVar39 + 1);
        if ((uVar27 < uVar49) ||
           (puVar57 = puVar35, (BYTE *)((long)puVar51 + (long)puVar35) == pInLimit))
        goto LAB_0011e0f3;
      }
    }
    local_f0[uVar55] = uVar47;
    puVar35 = (uint *)0x0;
    puVar29 = (uint *)0x0;
    while( true ) {
      bVar62 = iVar53 == 0;
      iVar53 = iVar53 + -1;
      if ((bVar62) || (uVar15 < UVar11 + (UVar11 == 0))) break;
      puVar37 = puVar35;
      if (puVar29 < puVar35) {
        puVar37 = puVar29;
      }
      if (uVar47 <= uVar15) goto LAB_0011fd9c;
      if ((long)puVar37 + (ulong)uVar15 < (ulong)uVar13) goto LAB_0011fdbb;
      pBVar60 = local_110 + uVar15;
      if ((uVar13 <= uVar15) && (iVar24 = bcmp(pBVar60,puVar51,(size_t)puVar37), iVar24 != 0))
      goto LAB_0011fdda;
      sVar28 = ZSTD_count((BYTE *)((long)puVar51 + (long)puVar37),pBVar60 + (long)puVar37,pInLimit);
      puVar37 = (uint *)(sVar28 + (long)puVar37);
      if (puVar57 < puVar37) {
        if (uVar14 < uVar15 || uVar14 - uVar15 == 0) goto LAB_0011fdf9;
        if ((uint *)(ulong)(uVar14 - uVar15) < puVar37) {
          uVar14 = uVar15 + (U32)puVar37;
        }
        local_e8->rep[uVar39 * 2 + -4] = (uVar47 + 2) - uVar15;
        local_e8->rep[uVar39 * 2 + -3] = (U32)puVar37;
        uVar39 = (ulong)((int)uVar39 + 1);
        if (((uint *)0x1000 < puVar37) ||
           (puVar57 = puVar37, (BYTE *)((long)puVar51 + (long)puVar37) == pInLimit)) break;
      }
      puVar46 = pUVar44 + (uVar15 & uVar54) * 2;
      if (pBVar60[(long)puVar37] < *(byte *)((long)puVar51 + (long)puVar37)) {
        *(uint *)local_1c0 = uVar15;
        if (uVar15 <= uVar12) goto LAB_0011de96;
        puVar46 = puVar46 + 1;
        puVar29 = puVar37;
        local_1c0 = (optState_t *)puVar46;
      }
      else {
        *local_1b0 = uVar15;
        local_1b0 = puVar46;
        puVar35 = puVar37;
        if (uVar15 <= uVar12) goto LAB_0011de83;
      }
      uVar15 = *puVar46;
    }
    goto LAB_0011dea7;
  }
  if (UVar16 != 3) {
    uVar42 = (ulong)(UVar10 == 0);
    uVar27 = (ms->cParams).targetLength;
    if (0xffe < uVar27) {
      uVar27 = 0xfff;
    }
    local_110 = (ms->window).base;
    uVar47 = iVar53 - (int)local_110;
    uVar39 = 0;
    uVar13 = *puVar51 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
    uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar12 = uVar47 - uVar54;
    if (uVar47 < uVar54) {
      uVar12 = 0;
    }
    uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar16 = (ms->window).lowLimit;
    UVar11 = uVar47 - uVar15;
    if (uVar47 - UVar16 <= uVar15) {
      UVar11 = UVar16;
    }
    pUVar44 = ms->chainTable;
    uVar15 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar16;
    }
    uVar55 = (ulong)((uVar54 & uVar47) * 2);
    local_1c0 = (optState_t *)(pUVar44 + uVar55);
    iVar53 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_1b0 = pUVar44 + uVar55 + 1;
    local_f0 = ms->hashTable;
    uVar49 = local_f0[uVar13];
    local_b8 = (uint *)CONCAT44(local_b8._4_4_,uVar47 + 8);
    uVar14 = uVar47 + 9;
    uVar55 = uVar42 + 3;
    puVar57 = local_80;
    for (; uVar42 < uVar55; uVar42 = uVar42 + 1) {
      if (uVar42 == 3) {
        uVar48 = (*local_88)[0] - 1;
      }
      else {
        uVar48 = (*local_88)[uVar42];
      }
      if (uVar47 < uVar15) goto LAB_0011fd5e;
      if (uVar48 - 1 < uVar47 - uVar15) {
        if (*puVar51 != *(uint *)((long)puVar51 - (ulong)uVar48)) goto LAB_0011d9fe;
        sVar28 = ZSTD_count((BYTE *)(puVar51 + 1),(BYTE *)((long)(puVar51 + 1) - (ulong)uVar48),
                            pInLimit);
        uVar48 = (int)sVar28 + 4;
      }
      else {
        if (uVar47 < UVar11) goto LAB_0011fd7d;
LAB_0011d9fe:
        uVar48 = 0;
      }
      puVar35 = (uint *)(ulong)uVar48;
      if (puVar57 < puVar35) {
        local_e8->rep[uVar39 * 2 + -4] = (int)uVar42 - (uint)(UVar10 == 0);
        local_e8->rep[uVar39 * 2 + -3] = uVar48;
        uVar39 = (ulong)((int)uVar39 + 1);
        if ((uVar27 < uVar48) ||
           (puVar57 = puVar35, (BYTE *)((long)puVar51 + (long)puVar35) == pInLimit))
        goto LAB_0011e0f3;
      }
    }
    local_f0[uVar13] = uVar47;
    puVar35 = (uint *)0x0;
    puVar29 = (uint *)0x0;
    while( true ) {
      bVar62 = iVar53 == 0;
      iVar53 = iVar53 + -1;
      if ((bVar62) || (uVar49 < UVar11 + (UVar11 == 0))) break;
      puVar37 = puVar35;
      if (puVar29 < puVar35) {
        puVar37 = puVar29;
      }
      if (uVar47 <= uVar49) goto LAB_0011fd9c;
      if ((long)puVar37 + (ulong)uVar49 < (ulong)uVar15) goto LAB_0011fdbb;
      pBVar60 = local_110 + uVar49;
      if ((uVar15 <= uVar49) && (iVar24 = bcmp(pBVar60,puVar51,(size_t)puVar37), iVar24 != 0))
      goto LAB_0011fdda;
      sVar28 = ZSTD_count((BYTE *)((long)puVar51 + (long)puVar37),pBVar60 + (long)puVar37,pInLimit);
      puVar37 = (uint *)(sVar28 + (long)puVar37);
      if (puVar57 < puVar37) {
        if (uVar14 < uVar49 || uVar14 - uVar49 == 0) goto LAB_0011fdf9;
        if ((uint *)(ulong)(uVar14 - uVar49) < puVar37) {
          uVar14 = uVar49 + (U32)puVar37;
        }
        local_e8->rep[uVar39 * 2 + -4] = (uVar47 + 2) - uVar49;
        local_e8->rep[uVar39 * 2 + -3] = (U32)puVar37;
        uVar39 = (ulong)((int)uVar39 + 1);
        if (((uint *)0x1000 < puVar37) ||
           (puVar57 = puVar37, (BYTE *)((long)puVar51 + (long)puVar37) == pInLimit)) break;
      }
      puVar46 = pUVar44 + (uVar49 & uVar54) * 2;
      if (pBVar60[(long)puVar37] < *(byte *)((long)puVar51 + (long)puVar37)) {
        *(uint *)local_1c0 = uVar49;
        if (uVar49 <= uVar12) goto LAB_0011de96;
        puVar46 = puVar46 + 1;
        puVar29 = puVar37;
        local_1c0 = (optState_t *)puVar46;
      }
      else {
        *local_1b0 = uVar49;
        local_1b0 = puVar46;
        puVar35 = puVar37;
        if (uVar49 <= uVar12) goto LAB_0011de83;
      }
      uVar49 = *puVar46;
    }
    goto LAB_0011dea7;
  }
  uVar42 = (ulong)(UVar10 == 0);
  uVar27 = (ms->cParams).targetLength;
  if (0xffe < uVar27) {
    uVar27 = 0xfff;
  }
  local_110 = (ms->window).base;
  uVar47 = iVar53 - (int)local_110;
  uVar39 = 0;
  uVar13 = *puVar51 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
  uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar12 = uVar47 - uVar54;
  if (uVar47 < uVar54) {
    uVar12 = 0;
  }
  uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar16 = (ms->window).lowLimit;
  UVar11 = uVar47 - uVar15;
  if (uVar47 - UVar16 <= uVar15) {
    UVar11 = UVar16;
  }
  pUVar44 = ms->chainTable;
  uVar15 = (ms->window).dictLimit;
  if (ms->loadedDictEnd != 0) {
    UVar11 = UVar16;
  }
  uVar48 = UVar11 + (UVar11 == 0);
  uVar55 = (ulong)((uVar54 & uVar47) * 2);
  local_190 = pUVar44 + uVar55;
  iVar53 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  local_188 = pUVar44 + uVar55 + 1;
  local_f0 = ms->hashTable;
  uVar14 = local_f0[uVar13];
  local_b8 = (uint *)CONCAT44(local_b8._4_4_,uVar47 + 8);
  uVar49 = uVar47 + 9;
  uVar55 = uVar42 + 3;
  puVar57 = local_80;
  for (; uVar42 < uVar55; uVar42 = uVar42 + 1) {
    if (uVar42 == 3) {
      uVar26 = (*local_88)[0] - 1;
    }
    else {
      uVar26 = (*local_88)[uVar42];
    }
    if (uVar47 < uVar15) {
LAB_0011fd5e:
      __assert_fail("current >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x47d0,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar26 - 1 < uVar47 - uVar15) {
      if (((*(uint *)((long)puVar51 - (ulong)uVar26) ^ *puVar51) & 0xffffff) != 0)
      goto LAB_0011d189;
      sVar28 = ZSTD_count((BYTE *)((long)puVar51 + 3),(BYTE *)((long)puVar51 + 3) + -(ulong)uVar26,
                          pInLimit);
      uVar26 = (int)sVar28 + 3;
    }
    else {
      if (uVar47 < UVar11) {
LAB_0011fd7d:
        __assert_fail("current >= windowLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x47d9,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
LAB_0011d189:
      uVar26 = 0;
    }
    puVar35 = (uint *)(ulong)uVar26;
    if (puVar57 < puVar35) {
      local_e8->rep[uVar39 * 2 + -4] = (int)uVar42 - (uint)(UVar10 == 0);
      local_e8->rep[uVar39 * 2 + -3] = uVar26;
      uVar39 = (ulong)((int)uVar39 + 1);
      if ((uVar27 < uVar26) ||
         (puVar57 = puVar35, (BYTE *)((long)puVar51 + (long)puVar35) == pInLimit))
      goto LAB_0011e0f3;
    }
  }
  if ((((puVar57 < (uint *)0x3) &&
       (UVar16 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3_1,(BYTE *)puVar51),
       uVar48 <= UVar16)) && (uVar47 - UVar16 < 0x40000)) &&
     (puVar35 = (uint *)ZSTD_count((BYTE *)puVar51,local_110 + UVar16,pInLimit),
     (uint *)0x2 < puVar35)) {
    if (uVar47 <= UVar16) {
LAB_00120046:
      __assert_fail("current > matchIndex3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4806,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if ((int)uVar39 != 0) {
LAB_00120065:
      __assert_fail("mnum==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4807,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_e8->price = (uVar47 - UVar16) + 2;
    local_e8->off = (U32)puVar35;
    uVar39 = 1;
    puVar57 = puVar35;
    if (puVar35 <= (uint *)(ulong)uVar27 && (BYTE *)((long)puVar35 + (long)puVar51) != pInLimit)
    goto LAB_0011df05;
    UVar16 = uVar47 + 1;
    uVar39 = 1;
  }
  else {
LAB_0011df05:
    local_f0[uVar13] = uVar47;
    puVar35 = (uint *)0x0;
    puVar29 = (uint *)0x0;
LAB_0011df26:
    bVar62 = iVar53 == 0;
    iVar53 = iVar53 + -1;
    if ((bVar62) || (uVar14 < uVar48)) goto LAB_0011e0ce;
    puVar37 = puVar35;
    if (puVar29 < puVar35) {
      puVar37 = puVar29;
    }
    if (uVar47 <= uVar14) {
LAB_0011fd9c:
      __assert_fail("current > matchIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4819,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if ((long)puVar37 + (ulong)uVar14 < (ulong)uVar15) {
LAB_0011fdbb:
      __assert_fail("matchIndex+matchLength >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x481c,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    pBVar60 = local_110 + uVar14;
    if ((uVar15 <= uVar14) && (iVar24 = bcmp(pBVar60,puVar51,(size_t)puVar37), iVar24 != 0)) {
LAB_0011fdda:
      __assert_fail("memcmp(match, ip, matchLength) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x481e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    sVar28 = ZSTD_count((BYTE *)((long)puVar51 + (long)puVar37),pBVar60 + (long)puVar37,pInLimit);
    puVar37 = (uint *)(sVar28 + (long)puVar37);
    if (puVar57 < puVar37) {
      if (uVar49 < uVar14 || uVar49 - uVar14 == 0) {
LAB_0011fdf9:
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x482b,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((uint *)(ulong)(uVar49 - uVar14) < puVar37) {
        uVar49 = uVar14 + (U32)puVar37;
      }
      local_e8->rep[uVar39 * 2 + -4] = (uVar47 + 2) - uVar14;
      local_e8->rep[uVar39 * 2 + -3] = (U32)puVar37;
      uVar39 = (ulong)((int)uVar39 + 1);
      if (((uint *)0x1000 < puVar37) ||
         (puVar57 = puVar37, (BYTE *)((long)puVar51 + (long)puVar37) == pInLimit))
      goto LAB_0011e0ce;
    }
    pUVar40 = pUVar44 + (uVar14 & uVar54) * 2;
    if (*(byte *)((long)puVar51 + (long)puVar37) <= pBVar60[(long)puVar37]) {
      *local_188 = uVar14;
      local_188 = pUVar40;
      puVar35 = puVar37;
      if (uVar14 <= uVar12) {
        local_188 = local_c8;
        goto LAB_0011e0ce;
      }
LAB_0011e092:
      uVar14 = *pUVar40;
      goto LAB_0011df26;
    }
    *local_190 = uVar14;
    if (uVar12 < uVar14) {
      pUVar40 = pUVar40 + 1;
      puVar29 = puVar37;
      local_190 = pUVar40;
      goto LAB_0011e092;
    }
    local_190 = local_c8;
LAB_0011e0ce:
    *local_188 = 0;
    *local_190 = 0;
    if (uVar49 <= (uint)local_b8) {
LAB_0011fe56:
      __assert_fail("matchEndIdx > current+8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4873,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    UVar16 = uVar49 - 8;
  }
  ms->nextToUpdate = UVar16;
  goto LAB_0011e0f3;
LAB_0011aee6:
  local_1b8 = &nextToUpdate3_1;
  pUVar40 = local_170;
  puVar51 = puVar30;
  psVar52 = local_d8;
  puVar29 = puVar46;
  goto LAB_0011af0c;
LAB_0011aefa:
  pUVar40 = &nextToUpdate3_1;
  puVar51 = local_170;
  psVar52 = local_d8;
  puVar29 = puVar46;
LAB_0011af0c:
  *local_1b8 = 0;
  *pUVar40 = 0;
  if (uVar49 <= (uint)local_f8) goto LAB_0011fe56;
  ms->nextToUpdate = uVar49 - 8;
LAB_0011b173:
  pZVar34 = local_a8;
  src = local_b8;
  puVar57 = local_58;
  if ((int)puVar29 != 0) goto LAB_0011b1a4;
LAB_0011b195:
  local_178 = (uint *)((long)local_178 + 1);
  goto LAB_00119ef1;
LAB_0011b1a4:
  for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
    local_a8->rep[lVar33] = local_c8[lVar33];
  }
  local_a8->mlen = 0;
  local_a8->litlen = UVar10;
  UVar16 = ZSTD_litLengthPrice(UVar10,poVar1,2);
  pZVar34->price = UVar16;
  uVar12 = (int)puVar29 - 1;
  uVar27 = pZVar6[uVar12].len;
  if ((uint)local_78 < uVar27) {
    UVar16 = pZVar6[uVar12].off;
    uVar12 = 0;
    pZVar34 = local_a8;
  }
  else {
    UVar11 = ZSTD_litLengthPrice(0,poVar1,2);
    pZVar34 = local_e8;
    for (uVar39 = 1; uVar39 < uVar42; uVar39 = uVar39 + 1) {
      pZVar34->price = 0x40000000;
      pZVar34 = pZVar34 + 1;
    }
    pZVar34 = local_a8;
    for (puVar57 = (uint *)0x0; puVar57 != puVar29; puVar57 = (uint *)((long)puVar57 + 1)) {
      UVar22 = pZVar6[(long)puVar57].off;
      uVar27 = pZVar6[(long)puVar57].len;
      while (uVar12 = (uint)uVar39, uVar12 <= uVar27) {
        UVar17 = ZSTD_highbit32(UVar22 + 1);
        if (uVar12 < 3) goto LAB_0011fd20;
        if ((ms->opt).priceType == zop_predef) {
          UVar18 = ZSTD_fracWeight(uVar12 - 3);
          iVar53 = UVar17 * 0x100 + UVar18 + 0x1000;
        }
        else {
          UVar18 = (ms->opt).offCodeSumBasePrice;
          UVar19 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar17]);
          UVar20 = ZSTD_MLcode(uVar12 - 3);
          UVar5 = (ms->opt).matchLengthSumBasePrice;
          UVar21 = ZSTD_fracWeight(*(U32 *)((long)(ms->opt).matchLengthFreq + (ulong)(UVar20 << 2)))
          ;
          iVar53 = (((*(int *)((long)ML_bits + (ulong)(UVar20 << 2)) + UVar17) * 0x100 +
                    (UVar18 - UVar19) + UVar5) - UVar21) + 0x33;
          pZVar34 = local_a8;
        }
        uVar39 = uVar39 & 0xffffffff;
        pZVar34[uVar39].mlen = uVar12;
        pZVar34[uVar39].off = UVar22;
        pZVar34[uVar39].litlen = UVar10;
        pZVar34[uVar39].price = iVar53 + UVar11 + UVar16;
        uVar39 = (ulong)(uVar12 + 1);
      }
    }
    uVar55 = (ulong)((int)uVar39 - 1);
    local_170 = local_60;
    uVar39 = 1;
LAB_0011b386:
    uVar45 = uVar55 & 0xffffffff;
    if (uVar39 <= uVar45) {
      if (uVar39 == 0x1000) goto LAB_0011ff2f;
      pZVar41 = pZVar34 + uVar39;
      UVar16 = 1;
      if (pZVar34[uVar39 - 1].mlen == 0) {
        UVar16 = pZVar41[-1].litlen + 1;
      }
      puVar57 = (uint *)((long)local_178 + uVar39);
      iVar53 = pZVar41[-1].price;
      UVar10 = ZSTD_rawLiteralsCost
                         ((BYTE *)((long)puVar57 + -1),(U32)poVar1,(optState_t *)0x2,iVar53);
      UVar11 = ZSTD_litLengthPrice(UVar16,poVar1,2);
      UVar22 = ZSTD_litLengthPrice(UVar16 - 1,poVar1,2);
      pZVar34 = local_a8;
      iVar53 = (UVar11 + UVar10 + iVar53) - UVar22;
      if (999999999 < iVar53) goto LAB_0011ff4e;
      iVar24 = pZVar41->price;
      iVar23 = (int)uVar39;
      if (iVar24 < iVar53) {
        uVar27 = pZVar41->mlen;
        if (uVar39 < uVar27) goto LAB_0011ff8c;
        iVar53 = iVar24;
        if (uVar27 == 0) goto LAB_0011b49c;
        rVar63 = ZSTD_updateRep(local_a8[iVar23 - uVar27].rep,pZVar41->off,
                                (uint)(pZVar41->litlen == 0));
        *&pZVar41->rep = rVar63.rep;
        bVar56 = 1;
        bVar62 = false;
      }
      else {
        pZVar41->off = 0;
        pZVar41->mlen = 0;
        pZVar41->litlen = UVar16;
        pZVar41->price = iVar53;
LAB_0011b49c:
        pZVar41->rep[2] = pZVar41[-1].rep[2];
        *(undefined8 *)pZVar41->rep = *(undefined8 *)pZVar41[-1].rep;
        bVar62 = true;
        uVar27 = 0;
        bVar56 = 0;
      }
      if (local_80 < puVar57) goto LAB_0011b529;
      if (uVar39 == uVar45) goto LAB_0011c9b5;
      UVar10 = 0;
      if (bVar62) {
        UVar10 = pZVar41->litlen;
      }
      UVar16 = ZSTD_litLengthPrice(0,poVar1,2);
      pBVar60 = (ms->window).base;
      uVar45 = (ulong)ms->nextToUpdate;
      pZVar34 = local_a8;
      if (puVar57 < pBVar60 + uVar45) goto LAB_0011b529;
      UVar11 = (ms->cParams).minMatch;
      while( true ) {
        uVar12 = (uint)uVar45;
        uVar27 = (uint)((long)puVar57 - (long)pBVar60);
        if (uVar27 <= uVar12) break;
        UVar22 = ZSTD_insertBt1(ms,pBVar60 + uVar45,(BYTE *)puVar3,UVar11,0);
        uVar45 = (ulong)(UVar22 + uVar12);
        if (UVar22 + uVar12 <= uVar12) goto LAB_0011fd3f;
      }
      if ((ulong)((long)puVar57 - (long)pBVar60) >> 0x20 == 0) {
        if ((ulong)((long)puVar3 - (long)pBVar60) >> 0x20 == 0) {
          ms->nextToUpdate = uVar27;
          uVar45 = (ulong)bVar56;
          iVar24 = (int)puVar57;
          if (UVar11 - 6 < 2) {
            uVar27 = (ms->cParams).targetLength;
            if (0xffe < uVar27) {
              uVar27 = 0xfff;
            }
            local_e0 = (U32 *)(ms->window).base;
            uVar12 = iVar24 - (int)local_e0;
            uVar61 = 0;
            local_b0 = (ulong)(*(long *)puVar57 * -0x30e4432340650000) >>
                       (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar24 = uVar12 - uVar47;
            if (uVar12 < uVar47) {
              iVar24 = 0;
            }
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,iVar24);
            uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar54 = (ms->window).lowLimit;
            uVar13 = uVar12 - uVar15;
            if (uVar12 - uVar54 <= uVar15) {
              uVar13 = uVar54;
            }
            local_70 = ms->chainTable;
            uVar15 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar13 = uVar54;
            }
            local_d0 = (BYTE *)CONCAT44(local_d0._4_4_,uVar13 + (uVar13 == 0));
            local_108 = (U32 *)CONCAT44(local_108._4_4_,uVar47);
            uVar50 = (ulong)((uVar47 & uVar12) * 2);
            local_100 = (optState_t *)(local_70 + uVar50);
            iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_1c0 = (optState_t *)(local_70 + uVar50 + 1);
            local_68 = ms->hashTable;
            uVar47 = local_68[local_b0];
            local_9c = uVar12 + 8;
            uVar54 = uVar12 + 9;
            uVar50 = uVar45 + 3;
            local_98 = puVar57 + 1;
            puVar51 = local_f0;
            for (; uVar45 < uVar50; uVar45 = uVar45 + 1) {
              if (uVar45 == 3) {
                uVar14 = pZVar41->rep[0] - 1;
              }
              else {
                uVar14 = local_170[uVar45];
              }
              if (uVar12 < uVar15) goto LAB_0011fd5e;
              if (uVar14 - 1 < uVar12 - uVar15) {
                if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar14)) goto LAB_0011ba13;
                sVar28 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar14),
                                    (BYTE *)puVar3);
                uVar14 = (int)sVar28 + 4;
              }
              else {
                if (uVar12 < uVar13) goto LAB_0011fd7d;
LAB_0011ba13:
                uVar14 = 0;
              }
              puVar35 = (uint *)(ulong)uVar14;
              if (puVar51 < puVar35) {
                pZVar6[uVar61].off = (int)uVar45 - (uint)bVar56;
                pZVar6[uVar61].len = uVar14;
                uVar61 = (ulong)((int)uVar61 + 1);
                if ((uVar27 < uVar14) ||
                   (puVar51 = puVar35, (uint *)((long)puVar57 + (long)puVar35) == puVar3))
                goto LAB_0011c7cf;
              }
            }
            local_68[local_b0] = uVar12;
            puVar35 = (uint *)0x0;
            puVar29 = (uint *)0x0;
            do {
              bVar62 = iVar24 == 0;
              iVar24 = iVar24 + -1;
              local_128 = local_100;
              if ((bVar62) || (uVar47 < (U32)local_d0)) goto LAB_0011c57f;
              puVar37 = puVar35;
              if (puVar29 < puVar35) {
                puVar37 = puVar29;
              }
              if (uVar12 <= uVar47) goto LAB_0011fd9c;
              if ((long)puVar37 + (ulong)uVar47 < (ulong)uVar15) goto LAB_0011fdbb;
              pBVar60 = (BYTE *)((ulong)uVar47 + (long)local_e0);
              if ((uVar15 <= uVar47) &&
                 (iVar25 = bcmp(pBVar60,puVar57,(size_t)puVar37), iVar25 != 0)) goto LAB_0011fdda;
              sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar37),pBVar60 + (long)puVar37,
                                  (BYTE *)puVar3);
              puVar37 = (uint *)(sVar28 + (long)puVar37);
              local_128 = local_100;
              if (puVar51 < puVar37) {
                if (uVar54 < uVar47 || uVar54 - uVar47 == 0) goto LAB_0011fdf9;
                if ((uint *)(ulong)(uVar54 - uVar47) < puVar37) {
                  uVar54 = uVar47 + (U32)puVar37;
                }
                pZVar6[uVar61].off = (uVar12 + 2) - uVar47;
                pZVar6[uVar61].len = (U32)puVar37;
                uVar61 = (ulong)((int)uVar61 + 1);
                if (((uint *)0x1000 < puVar37) ||
                   (puVar51 = puVar37, (uint *)((long)puVar57 + (long)puVar37) == puVar3))
                goto LAB_0011c57f;
              }
              poVar36 = (optState_t *)(local_70 + (uVar47 & (uint)local_108) * 2);
              if (pBVar60[(long)puVar37] < *(byte *)((long)puVar57 + (long)puVar37)) {
                *(uint *)&local_100->litFreq = uVar47;
                if (uVar47 <= (uint)local_f8) {
                  local_128 = (optState_t *)&nextToUpdate3_1;
                  goto LAB_0011c57f;
                }
                poVar36 = (optState_t *)((long)&poVar36->litFreq + 4);
                puVar29 = puVar37;
                local_100 = poVar36;
              }
              else {
                *(uint *)&local_1c0->litFreq = uVar47;
                local_1c0 = poVar36;
                puVar35 = puVar37;
                if (uVar47 <= (uint)local_f8) {
                  local_1c0 = (optState_t *)&nextToUpdate3_1;
                  goto LAB_0011c57f;
                }
              }
              uVar47 = *(uint *)&poVar36->litFreq;
            } while( true );
          }
          if (UVar11 == 5) {
            uVar27 = (ms->cParams).targetLength;
            if (0xffe < uVar27) {
              uVar27 = 0xfff;
            }
            local_d0 = (ms->window).base;
            uVar12 = iVar24 - (int)local_d0;
            uVar61 = 0;
            local_b0 = (ulong)(*(long *)puVar57 * -0x30e4432345000000) >>
                       (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar24 = uVar12 - uVar47;
            if (uVar12 < uVar47) {
              iVar24 = 0;
            }
            local_108 = (U32 *)CONCAT44(local_108._4_4_,iVar24);
            uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar54 = (ms->window).lowLimit;
            uVar13 = uVar12 - uVar15;
            if (uVar12 - uVar54 <= uVar15) {
              uVar13 = uVar54;
            }
            local_f8 = ms->chainTable;
            uVar15 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar13 = uVar54;
            }
            local_100 = (optState_t *)CONCAT44(local_100._4_4_,uVar13 + (uVar13 == 0));
            local_e0 = (U32 *)CONCAT44(local_e0._4_4_,uVar47);
            uVar50 = (ulong)((uVar47 & uVar12) * 2);
            local_128 = (optState_t *)(local_f8 + uVar50);
            iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_1c0 = (optState_t *)(local_f8 + uVar50 + 1);
            local_68 = ms->hashTable;
            pUVar44 = (U32 *)(ulong)local_68[local_b0];
            local_9c = uVar12 + 8;
            uVar54 = uVar12 + 9;
            uVar50 = uVar45 + 3;
            local_98 = puVar57 + 1;
            puVar51 = local_f0;
            local_70 = pUVar44;
            for (; uVar45 < uVar50; uVar45 = uVar45 + 1) {
              if (uVar45 == 3) {
                uVar47 = pZVar41->rep[0] - 1;
              }
              else {
                uVar47 = local_170[uVar45];
              }
              if (uVar12 < uVar15) goto LAB_0011fd5e;
              if (uVar47 - 1 < uVar12 - uVar15) {
                if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar47)) goto LAB_0011be1a;
                sVar28 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar47),
                                    (BYTE *)puVar3);
                uVar47 = (int)sVar28 + 4;
                pUVar44 = local_70;
              }
              else {
                if (uVar12 < uVar13) goto LAB_0011fd7d;
LAB_0011be1a:
                uVar47 = 0;
              }
              puVar35 = (uint *)(ulong)uVar47;
              if (puVar51 < puVar35) {
                pZVar6[uVar61].off = (int)uVar45 - (uint)bVar56;
                pZVar6[uVar61].len = uVar47;
                uVar61 = (ulong)((int)uVar61 + 1);
                if ((uVar27 < uVar47) ||
                   (puVar51 = puVar35, (uint *)((long)puVar57 + (long)puVar35) == puVar3))
                goto LAB_0011c7cf;
              }
            }
            local_68[local_b0] = uVar12;
            puVar35 = (uint *)0x0;
            puVar29 = (uint *)0x0;
            while (bVar62 = iVar24 != 0, iVar24 = iVar24 + -1, bVar62) {
              uVar27 = (uint)pUVar44;
              if (uVar27 < (uint)local_100) break;
              puVar37 = puVar35;
              if (puVar29 < puVar35) {
                puVar37 = puVar29;
              }
              if (uVar12 <= uVar27) goto LAB_0011fd9c;
              if ((long)puVar37 + ((ulong)pUVar44 & 0xffffffff) < (ulong)uVar15) goto LAB_0011fdbb;
              pBVar60 = local_d0 + ((ulong)pUVar44 & 0xffffffff);
              if ((uVar15 <= uVar27) &&
                 (iVar25 = bcmp(pBVar60,puVar57,(size_t)puVar37), iVar25 != 0)) goto LAB_0011fdda;
              sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar37),pBVar60 + (long)puVar37,
                                  (BYTE *)puVar3);
              puVar37 = (uint *)(sVar28 + (long)puVar37);
              if (puVar51 < puVar37) {
                if (uVar54 < uVar27 || uVar54 - uVar27 == 0) goto LAB_0011fdf9;
                if ((uint *)(ulong)(uVar54 - uVar27) < puVar37) {
                  uVar54 = (U32)puVar37 + uVar27;
                }
                pZVar6[uVar61].off = (uVar12 + 2) - uVar27;
                pZVar6[uVar61].len = (U32)puVar37;
                uVar61 = (ulong)((int)uVar61 + 1);
                if (((uint *)0x1000 < puVar37) ||
                   (puVar51 = puVar37, (uint *)((long)puVar57 + (long)puVar37) == puVar3)) break;
              }
              poVar36 = (optState_t *)(local_f8 + (uVar27 & (uint)local_e0) * 2);
              if (pBVar60[(long)puVar37] < *(byte *)((long)puVar57 + (long)puVar37)) {
                *(uint *)&local_128->litFreq = uVar27;
                if (uVar27 <= (uint)local_108) goto LAB_0011c56b;
                poVar36 = (optState_t *)((long)&poVar36->litFreq + 4);
                puVar29 = puVar37;
                local_128 = poVar36;
              }
              else {
                *(uint *)&local_1c0->litFreq = uVar27;
                local_1c0 = poVar36;
                puVar35 = puVar37;
                if (uVar27 <= (uint)local_108) goto LAB_0011c552;
              }
              pUVar44 = (U32 *)(ulong)*(uint *)&poVar36->litFreq;
            }
            goto LAB_0011c57f;
          }
          if (UVar11 != 3) {
            uVar27 = (ms->cParams).targetLength;
            if (0xffe < uVar27) {
              uVar27 = 0xfff;
            }
            local_d0 = (ms->window).base;
            uVar12 = iVar24 - (int)local_d0;
            uVar61 = 0;
            local_b0 = (ulong)(*puVar57 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar24 = uVar12 - uVar47;
            if (uVar12 < uVar47) {
              iVar24 = 0;
            }
            local_108 = (U32 *)CONCAT44(local_108._4_4_,iVar24);
            uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar54 = (ms->window).lowLimit;
            uVar13 = uVar12 - uVar15;
            if (uVar12 - uVar54 <= uVar15) {
              uVar13 = uVar54;
            }
            local_f8 = ms->chainTable;
            uVar15 = (ms->window).dictLimit;
            if (ms->loadedDictEnd != 0) {
              uVar13 = uVar54;
            }
            local_100 = (optState_t *)CONCAT44(local_100._4_4_,uVar13 + (uVar13 == 0));
            local_e0 = (U32 *)CONCAT44(local_e0._4_4_,uVar47);
            uVar50 = (ulong)((uVar47 & uVar12) * 2);
            local_128 = (optState_t *)(local_f8 + uVar50);
            iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_1c0 = (optState_t *)(local_f8 + uVar50 + 1);
            local_68 = ms->hashTable;
            pUVar44 = (U32 *)(ulong)local_68[local_b0];
            local_9c = uVar12 + 8;
            uVar54 = uVar12 + 9;
            uVar50 = uVar45 + 3;
            local_98 = puVar57 + 1;
            puVar51 = local_f0;
            local_70 = pUVar44;
            for (; uVar45 < uVar50; uVar45 = uVar45 + 1) {
              if (uVar45 == 3) {
                uVar47 = pZVar41->rep[0] - 1;
              }
              else {
                uVar47 = local_170[uVar45];
              }
              if (uVar12 < uVar15) goto LAB_0011fd5e;
              if (uVar47 - 1 < uVar12 - uVar15) {
                if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar47)) goto LAB_0011c060;
                sVar28 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar47),
                                    (BYTE *)puVar3);
                uVar47 = (int)sVar28 + 4;
                pUVar44 = local_70;
              }
              else {
                if (uVar12 < uVar13) goto LAB_0011fd7d;
LAB_0011c060:
                uVar47 = 0;
              }
              puVar35 = (uint *)(ulong)uVar47;
              if (puVar51 < puVar35) {
                pZVar6[uVar61].off = (int)uVar45 - (uint)bVar56;
                pZVar6[uVar61].len = uVar47;
                uVar61 = (ulong)((int)uVar61 + 1);
                if ((uVar27 < uVar47) ||
                   (puVar51 = puVar35, (uint *)((long)puVar57 + (long)puVar35) == puVar3))
                goto LAB_0011c7cf;
              }
            }
            local_68[local_b0] = uVar12;
            puVar35 = (uint *)0x0;
            puVar29 = (uint *)0x0;
            while (bVar62 = iVar24 != 0, iVar24 = iVar24 + -1, bVar62) {
              uVar27 = (uint)pUVar44;
              if (uVar27 < (uint)local_100) break;
              puVar37 = puVar35;
              if (puVar29 < puVar35) {
                puVar37 = puVar29;
              }
              if (uVar12 <= uVar27) goto LAB_0011fd9c;
              if ((long)puVar37 + ((ulong)pUVar44 & 0xffffffff) < (ulong)uVar15) goto LAB_0011fdbb;
              pBVar60 = local_d0 + ((ulong)pUVar44 & 0xffffffff);
              if ((uVar15 <= uVar27) &&
                 (iVar25 = bcmp(pBVar60,puVar57,(size_t)puVar37), iVar25 != 0)) goto LAB_0011fdda;
              sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar37),pBVar60 + (long)puVar37,
                                  (BYTE *)puVar3);
              puVar37 = (uint *)(sVar28 + (long)puVar37);
              if (puVar51 < puVar37) {
                if (uVar54 < uVar27 || uVar54 - uVar27 == 0) goto LAB_0011fdf9;
                if ((uint *)(ulong)(uVar54 - uVar27) < puVar37) {
                  uVar54 = (U32)puVar37 + uVar27;
                }
                pZVar6[uVar61].off = (uVar12 + 2) - uVar27;
                pZVar6[uVar61].len = (U32)puVar37;
                uVar61 = (ulong)((int)uVar61 + 1);
                if (((uint *)0x1000 < puVar37) ||
                   (puVar51 = puVar37, (uint *)((long)puVar57 + (long)puVar37) == puVar3)) break;
              }
              poVar36 = (optState_t *)(local_f8 + (uVar27 & (uint)local_e0) * 2);
              if (pBVar60[(long)puVar37] < *(byte *)((long)puVar57 + (long)puVar37)) {
                *(uint *)&local_128->litFreq = uVar27;
                if (uVar27 <= (uint)local_108) goto LAB_0011c56b;
                poVar36 = (optState_t *)((long)&poVar36->litFreq + 4);
                puVar29 = puVar37;
                local_128 = poVar36;
              }
              else {
                *(uint *)&local_1c0->litFreq = uVar27;
                local_1c0 = poVar36;
                puVar35 = puVar37;
                if (uVar27 <= (uint)local_108) goto LAB_0011c552;
              }
              pUVar44 = (U32 *)(ulong)*(uint *)&poVar36->litFreq;
            }
            goto LAB_0011c57f;
          }
          uVar27 = (ms->cParams).targetLength;
          if (0xffe < uVar27) {
            uVar27 = 0xfff;
          }
          local_100 = (optState_t *)(ms->window).base;
          uVar12 = iVar24 - (int)local_100;
          uVar61 = 0;
          local_b0 = (ulong)(*puVar57 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar24 = uVar12 - uVar47;
          if (uVar12 < uVar47) {
            iVar24 = 0;
          }
          local_e0 = (U32 *)CONCAT44(local_e0._4_4_,iVar24);
          uVar15 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar54 = (ms->window).lowLimit;
          uVar13 = uVar12 - uVar15;
          if (uVar12 - uVar54 <= uVar15) {
            uVar13 = uVar54;
          }
          local_108 = ms->chainTable;
          uVar15 = (ms->window).dictLimit;
          if (ms->loadedDictEnd != 0) {
            uVar13 = uVar54;
          }
          uVar54 = uVar13 + (uVar13 == 0);
          local_d0 = (BYTE *)CONCAT44(local_d0._4_4_,uVar47);
          uVar50 = (ulong)((uVar47 & uVar12) * 2);
          local_128 = (optState_t *)(local_108 + uVar50);
          iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_1c0 = (optState_t *)(local_108 + uVar50 + 1);
          pUVar44 = (U32 *)(ulong)-(uint)bVar56;
          local_68 = ms->hashTable;
          local_98 = (U32 *)(ulong)local_68[local_b0];
          local_9c = uVar12 + 8;
          uVar47 = uVar12 + 9;
          uVar50 = uVar45 + 3;
          local_70 = (U32 *)((long)puVar57 + 3);
          puVar51 = local_f0;
          local_f8 = pUVar44;
          for (; uVar45 < uVar50; uVar45 = uVar45 + 1) {
            if (uVar45 == 3) {
              uVar14 = pZVar41->rep[0] - 1;
            }
            else {
              uVar14 = local_170[uVar45];
            }
            if (uVar12 < uVar15) goto LAB_0011fd5e;
            if (uVar14 - 1 < uVar12 - uVar15) {
              if (((*(uint *)((long)puVar57 - (ulong)uVar14) ^ *puVar57) & 0xffffff) != 0)
              goto LAB_0011b7bf;
              sVar28 = ZSTD_count((BYTE *)local_70,(BYTE *)((long)local_70 - (ulong)uVar14),
                                  (BYTE *)puVar3);
              uVar14 = (int)sVar28 + 3;
              pUVar44 = local_f8;
            }
            else {
              if (uVar12 < uVar13) goto LAB_0011fd7d;
LAB_0011b7bf:
              uVar14 = 0;
            }
            puVar35 = (uint *)(ulong)uVar14;
            if (puVar51 < puVar35) {
              pZVar6[uVar61].off = (int)pUVar44 + (int)uVar45;
              pZVar6[uVar61].len = uVar14;
              uVar61 = (ulong)((int)uVar61 + 1);
              if ((uVar27 < uVar14) ||
                 (puVar51 = puVar35, (uint *)((long)puVar57 + (long)puVar35) == puVar3))
              goto LAB_0011c7cf;
            }
          }
          if ((((puVar51 < (uint *)0x3) &&
               (UVar11 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3,(BYTE *)puVar57),
               uVar54 <= UVar11)) && (uVar12 - UVar11 < 0x40000)) &&
             (puVar35 = (uint *)ZSTD_count((BYTE *)puVar57,
                                           (BYTE *)((long)&local_100->litFreq + (ulong)UVar11),
                                           (BYTE *)puVar3), (uint *)0x2 < puVar35)) {
            if (uVar12 <= UVar11) goto LAB_00120046;
            if ((int)uVar61 != 0) goto LAB_00120065;
            pZVar6->off = (uVar12 - UVar11) + 2;
            pZVar6->len = (U32)puVar35;
            uVar61 = 1;
            puVar51 = puVar35;
            if (puVar35 <= (uint *)(ulong)uVar27 &&
                (uint *)((long)puVar35 + (long)puVar57) != puVar3) goto LAB_0011c5b9;
            UVar11 = uVar12 + 1;
            uVar61 = 1;
          }
          else {
LAB_0011c5b9:
            local_68[local_b0] = uVar12;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar12 + 2);
            puVar35 = (uint *)0x0;
            puVar29 = (uint *)0x0;
            pUVar44 = local_98;
LAB_0011c5da:
            bVar62 = iVar24 == 0;
            iVar24 = iVar24 + -1;
            if ((bVar62) || (uVar27 = (uint)pUVar44, uVar27 < uVar54)) goto LAB_0011c7ac;
            puVar37 = puVar35;
            if (puVar29 < puVar35) {
              puVar37 = puVar29;
            }
            if (uVar12 <= uVar27) goto LAB_0011fd9c;
            if ((long)puVar37 + ((ulong)pUVar44 & 0xffffffff) < (ulong)uVar15) goto LAB_0011fdbb;
            pvVar59 = (void *)((long)&local_100->litFreq + ((ulong)pUVar44 & 0xffffffff));
            if ((uVar15 <= uVar27) && (iVar25 = bcmp(pvVar59,puVar57,(size_t)puVar37), iVar25 != 0))
            goto LAB_0011fdda;
            sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar37),
                                (BYTE *)((long)pvVar59 + (long)puVar37),(BYTE *)puVar3);
            puVar37 = (uint *)(sVar28 + (long)puVar37);
            if (puVar51 < puVar37) {
              if (uVar47 < uVar27 || uVar47 - uVar27 == 0) goto LAB_0011fdf9;
              if ((uint *)(ulong)(uVar47 - uVar27) < puVar37) {
                uVar47 = (U32)puVar37 + uVar27;
              }
              pZVar6[uVar61].off = (uint)local_f8 - uVar27;
              pZVar6[uVar61].len = (U32)puVar37;
              uVar61 = (ulong)((int)uVar61 + 1);
              if (((uint *)0x1000 < puVar37) ||
                 (puVar51 = puVar37, (uint *)((long)puVar57 + (long)puVar37) == puVar3))
              goto LAB_0011c7ac;
            }
            puVar46 = local_108 + (uVar27 & (U32)local_d0) * 2;
            if (*(byte *)((long)puVar57 + (long)puVar37) <= *(byte *)((long)pvVar59 + (long)puVar37)
               ) {
              *(uint *)local_1c0 = uVar27;
              local_1c0 = (optState_t *)puVar46;
              puVar35 = puVar37;
              if (uVar27 <= (uint)local_e0) {
                local_1c0 = (optState_t *)&nextToUpdate3_1;
                goto LAB_0011c7ac;
              }
LAB_0011c751:
              pUVar44 = (U32 *)(ulong)*puVar46;
              goto LAB_0011c5da;
            }
            *(uint *)local_128 = uVar27;
            if ((uint)local_e0 < uVar27) {
              puVar46 = puVar46 + 1;
              puVar29 = puVar37;
              local_128 = (optState_t *)puVar46;
              goto LAB_0011c751;
            }
            local_128 = (optState_t *)&nextToUpdate3_1;
LAB_0011c7ac:
            *(uint *)local_1c0 = 0;
            *(uint *)local_128 = 0;
            if (uVar47 <= local_9c) goto LAB_0011fe56;
            UVar11 = uVar47 - 8;
          }
          ms->nextToUpdate = UVar11;
          goto LAB_0011c7cf;
        }
        goto LAB_0011fe37;
      }
      goto LAB_0011fe18;
    }
    uVar27 = pZVar34[uVar45].mlen;
    uVar39 = uVar45;
    iVar53 = pZVar34[uVar45].price;
LAB_0011c9b5:
    local_50 = iVar53;
    UVar16 = pZVar34[uVar39].off;
    UVar10 = pZVar34[uVar39].litlen;
    local_40 = pZVar34[uVar39].rep[2];
    local_48 = *(undefined8 *)pZVar34[uVar39].rep;
    uVar12 = (uint)uVar55 - (UVar10 + uVar27);
    if ((uint)uVar55 < UVar10 + uVar27 || uVar12 == 0) {
      uVar12 = 0;
    }
    else if (0xfff < uVar12) goto LAB_00120084;
  }
LAB_0011c9fb:
  if (pZVar34->mlen != 0) goto LAB_00120008;
  if (uVar27 == 0) {
    local_c8 = *&pZVar34[uVar12].rep;
  }
  else {
    local_c8 = (U32  [3])ZSTD_updateRep(pZVar34[uVar12].rep,UVar16,(uint)(UVar10 == 0));
  }
  if (0xfff < uVar12 + 1) goto LAB_00120027;
  uVar55 = (ulong)(uVar12 + 1);
  pZVar34[uVar55].price = local_50;
  pZVar34[uVar55].off = UVar16;
  pZVar34[uVar55].mlen = uVar27;
  pZVar34[uVar55].litlen = UVar10;
  *(undefined8 *)pZVar34[uVar55].rep = local_48;
  pZVar34[uVar55].rep[2] = local_40;
  uVar39 = (ulong)uVar12;
  while (uVar27 = (uint)uVar39, uVar27 != 0) {
    uVar47 = pZVar34[uVar39].litlen + pZVar34[uVar39].mlen;
    pZVar41 = pZVar34 + uVar39;
    iVar53 = pZVar41->price;
    UVar10 = pZVar41->off;
    UVar11 = pZVar41->mlen;
    UVar22 = pZVar41->litlen;
    pZVar41 = pZVar34 + uVar39;
    UVar16 = pZVar41->rep[0];
    uVar8 = *(undefined8 *)(&pZVar41->litlen + 2);
    pZVar9 = pZVar34 + uVar12;
    pZVar9->litlen = pZVar41->litlen;
    pZVar9->rep[0] = UVar16;
    *(undefined8 *)(&pZVar9->litlen + 2) = uVar8;
    pZVar41 = pZVar34 + uVar12;
    pZVar41->price = iVar53;
    pZVar41->off = UVar10;
    pZVar41->mlen = UVar11;
    pZVar41->litlen = UVar22;
    uVar39 = (ulong)(uVar27 - uVar47);
    if (uVar27 < uVar47) {
      uVar39 = 0;
    }
    uVar12 = uVar12 - 1;
  }
  src = local_b8;
  puVar57 = local_58;
  for (uVar39 = (ulong)(uVar12 + 1); uVar39 <= uVar55; uVar39 = uVar39 + 1) {
    uVar27 = pZVar34[uVar39].litlen;
    uVar45 = (ulong)uVar27;
    UVar16 = pZVar34[uVar39].mlen;
    if (UVar16 == 0) {
      if (uVar39 != uVar55) goto LAB_0011fef1;
      local_178 = (uint *)(uVar45 + (long)src);
    }
    else {
      puVar57 = (uint *)(uVar45 + (long)src);
      if (puVar3 < puVar57) goto LAB_0011fed2;
      UVar10 = local_a8[uVar39].off;
      ZSTD_updateStats(poVar1,uVar27,(BYTE *)src,UVar10,UVar16);
      if (local_d8->maxNbSeq <=
          (ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3))
      goto LAB_0011fe75;
      if (0x20000 < local_d8->maxNbLit) goto LAB_0011fe94;
      pBVar60 = local_d8->lit;
      if (local_d8->litStart + local_d8->maxNbLit < pBVar60 + uVar45) goto LAB_0011feb3;
      if (local_90 < puVar57) {
        ZSTD_safecopyLiterals(pBVar60,(BYTE *)src,(BYTE *)puVar57,(BYTE *)local_90);
LAB_0011cbbc:
        local_d8->lit = local_d8->lit + uVar45;
        if (0xffff < uVar27) {
          if (local_d8->longLengthID != 0) goto LAB_0011ff6d;
          local_d8->longLengthID = 1;
          local_d8->longLengthPos =
               (U32)((ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar60 = *src;
        *(undefined8 *)(pBVar60 + 8) = uVar8;
        if (0x10 < uVar27) {
          pBVar60 = local_d8->lit;
          lVar33 = (long)(pBVar60 + 0x10) - ((long)src + 0x10);
          if (lVar33 < 8) {
            if (-0x10 < lVar33) goto LAB_0011ffca;
          }
          else if (0xffffffffffffffe0 < lVar33 - 0x10U) goto LAB_0011ffab;
          uVar8 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar60 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar60 + 0x18) = uVar8;
          if (uVar45 - 0x21 < 0xffffffffffffffef) {
            lVar33 = 0;
            do {
              puVar4 = (undefined8 *)((long)src + lVar33 + 0x20);
              uVar8 = puVar4[1];
              pBVar58 = pBVar60 + lVar33 + 0x20;
              *(undefined8 *)pBVar58 = *puVar4;
              *(undefined8 *)(pBVar58 + 8) = uVar8;
              puVar4 = (undefined8 *)((long)src + lVar33 + 0x30);
              uVar8 = puVar4[1];
              *(undefined8 *)(pBVar58 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar58 + 0x18) = uVar8;
              lVar33 = lVar33 + 0x20;
            } while (pBVar58 + 0x20 < pBVar60 + uVar45);
            goto LAB_0011cbbc;
          }
        }
        local_d8->lit = local_d8->lit + uVar45;
      }
      psVar7 = local_d8->sequences;
      psVar7->litLength = (U16)uVar27;
      psVar7->offset = UVar10 + 1;
      if (0xffff < UVar16 - 3) {
        if (local_d8->longLengthID != 0) goto LAB_0011ff10;
        local_d8->longLengthID = 2;
        local_d8->longLengthPos = (U32)((ulong)((long)psVar7 - (long)local_d8->sequencesStart) >> 3)
        ;
      }
      psVar7->matchLength = (U16)(UVar16 - 3);
      local_d8->sequences = psVar7 + 1;
      src = (void *)((long)src + (ulong)(UVar16 + uVar27));
      puVar57 = local_58;
      local_178 = (uint *)src;
    }
    pZVar34 = local_a8;
  }
  ZSTD_setBasePrices(poVar1,2);
  puVar51 = extraout_RDX_03;
  goto LAB_00119edc;
LAB_0011c552:
  local_1c0 = (optState_t *)&nextToUpdate3_1;
  goto LAB_0011c57f;
LAB_0011c56b:
  local_128 = (optState_t *)&nextToUpdate3_1;
LAB_0011c57f:
  *(uint *)&local_1c0->litFreq = 0;
  *(uint *)&local_128->litFreq = 0;
  if (uVar54 <= local_9c) goto LAB_0011fe56;
  ms->nextToUpdate = uVar54 - 8;
LAB_0011c7cf:
  pZVar34 = local_a8;
  if ((int)uVar61 != 0) {
    uVar12 = (int)uVar61 - 1;
    uVar27 = pZVar6[uVar12].len;
    if (((uint)local_78 < uVar27) || (0xfff < uVar27 + iVar23)) {
      UVar11 = 0;
      if (pZVar41->mlen == 0) {
        UVar11 = pZVar41->litlen;
      }
      UVar16 = pZVar6[uVar12].off;
      uVar12 = iVar23 - UVar11;
      if (0x1000 < uVar12) {
        uVar12 = 0;
      }
      goto LAB_0011c9fb;
    }
    for (uVar45 = 0; uVar45 != uVar61; uVar45 = uVar45 + 1) {
      local_1b8 = (uint *)uVar42;
      if (uVar45 != 0) {
        local_1b8 = (uint *)(ulong)(pZVar6[uVar45 - 1].len + 1);
      }
      UVar11 = pZVar6[uVar45].off;
      for (uVar50 = (ulong)pZVar6[uVar45].len; local_1b8 <= uVar50; uVar50 = uVar50 - 1) {
        UVar22 = ZSTD_highbit32(UVar11 + 1);
        if (uVar50 < 3) goto LAB_0011fd20;
        UVar17 = (U32)uVar50;
        if ((ms->opt).priceType == zop_predef) {
          UVar18 = ZSTD_fracWeight(UVar17 - 3);
          iVar24 = UVar22 * 0x100 + UVar18 + 0x1000;
        }
        else {
          UVar18 = (ms->opt).offCodeSumBasePrice;
          UVar19 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar22]);
          UVar20 = ZSTD_MLcode(UVar17 - 3);
          UVar5 = (ms->opt).matchLengthSumBasePrice;
          UVar21 = ZSTD_fracWeight(*(U32 *)((long)(ms->opt).matchLengthFreq + (ulong)(UVar20 << 2)))
          ;
          iVar24 = (((*(int *)((long)ML_bits + (ulong)(UVar20 << 2)) + UVar22) * 0x100 +
                    (UVar18 - UVar19) + UVar5) - UVar21) + 0x33;
          pZVar34 = local_a8;
        }
        iVar24 = iVar24 + UVar16 + iVar53;
        uVar38 = (ulong)(iVar23 + UVar17);
        if (((uint)uVar55 < iVar23 + UVar17) || (iVar24 < pZVar34[uVar38].price)) {
          uVar55 = uVar55 & 0xffffffff;
          pZVar41 = local_e8 + uVar55;
          for (; uVar55 < uVar38; uVar55 = uVar55 + 1) {
            pZVar41->price = 0x40000000;
            pZVar41 = pZVar41 + 1;
          }
          pZVar34[uVar38].mlen = UVar17;
          pZVar34[uVar38].off = UVar11;
          pZVar34[uVar38].litlen = UVar10;
          pZVar34[uVar38].price = iVar24;
        }
      }
    }
  }
LAB_0011b529:
  uVar39 = uVar39 + 1;
  local_170 = local_170 + 7;
  goto LAB_0011b386;
LAB_0011de83:
  local_1b0 = local_c8;
  goto LAB_0011dea7;
LAB_0011de96:
  local_1c0 = (optState_t *)local_c8;
LAB_0011dea7:
  *local_1b0 = 0;
  *(uint *)local_1c0 = 0;
  if (uVar14 <= (uint)local_b8) goto LAB_0011fe56;
  ms->nextToUpdate = uVar14 - 8;
LAB_0011e0f3:
  poVar1 = local_100;
  puVar57 = local_58;
  if ((int)uVar39 == 0) {
LAB_0011e105:
    puVar51 = (uint *)((long)puVar51 + 1);
    goto LAB_0011ced2;
  }
  for (lVar33 = 4; lVar33 != 7; lVar33 = lVar33 + 1) {
    pZVar34->rep[lVar33 + -4] = local_88[-2][lVar33 + 2];
  }
  pZVar34->mlen = 0;
  pZVar34->litlen = UVar10;
  UVar16 = ZSTD_litLengthPrice(UVar10,local_100,2);
  pZVar34->price = UVar16;
  uVar42 = (ulong)((int)uVar39 - 1);
  uVar27 = local_e8->rep[uVar42 * 2 + -3];
  if ((uint)local_70 < uVar27) {
    UVar11 = local_e8->rep[uVar42 * 2 + -4];
  }
  else {
    UVar11 = ZSTD_litLengthPrice(0,poVar1,2);
    pZVar41 = local_a8;
    for (uVar42 = 1; uVar42 < local_38; uVar42 = uVar42 + 1) {
      pZVar41->price = 0x40000000;
      pZVar41 = pZVar41 + 1;
    }
    for (uVar55 = 0; uVar55 != uVar39; uVar55 = uVar55 + 1) {
      UVar22 = local_e8->rep[uVar55 * 2 + -4];
      uVar27 = local_e8->rep[uVar55 * 2 + -3];
      while (uVar12 = (uint)uVar42, uVar12 <= uVar27) {
        UVar17 = ZSTD_highbit32(UVar22 + 1);
        if (uVar12 < 3) {
LAB_0011fd20:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x469f,
                        "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                       );
        }
        if ((ms->opt).priceType == zop_predef) {
          UVar18 = ZSTD_fracWeight(uVar12 - 3);
          iVar53 = UVar18 + UVar17 * 0x100 + 0x1000;
        }
        else {
          UVar18 = (ms->opt).offCodeSumBasePrice;
          UVar19 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar17]);
          UVar20 = ZSTD_MLcode(uVar12 - 3);
          UVar5 = (ms->opt).matchLengthSumBasePrice;
          UVar21 = ZSTD_fracWeight(*(U32 *)((long)(ms->opt).matchLengthFreq + (ulong)(UVar20 << 2)))
          ;
          iVar53 = (((*(int *)((long)ML_bits + (ulong)(UVar20 << 2)) + UVar17) * 0x100 +
                    (UVar18 - UVar19) + UVar5) - UVar21) + 0x33;
        }
        uVar42 = uVar42 & 0xffffffff;
        pZVar34[uVar42].mlen = uVar12;
        pZVar34[uVar42].off = UVar22;
        pZVar34[uVar42].litlen = UVar10;
        pZVar34[uVar42].price = iVar53 + UVar11 + UVar16;
        uVar42 = (ulong)(uVar12 + 1);
      }
    }
    uVar39 = (ulong)((int)uVar42 - 1);
    local_190 = local_98;
    uVar42 = 1;
LAB_0011e319:
    poVar1 = local_100;
    uVar55 = uVar39 & 0xffffffff;
    if (uVar42 <= uVar55) {
      if (uVar42 == 0x1000) {
LAB_0011ff2f:
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4928,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      pZVar41 = pZVar34 + uVar42;
      UVar16 = 1;
      if (pZVar34[uVar42 - 1].mlen == 0) {
        UVar16 = pZVar41[-1].litlen + 1;
      }
      puVar57 = (uint *)((long)puVar51 + uVar42);
      iVar53 = pZVar41[-1].price;
      UVar10 = ZSTD_rawLiteralsCost
                         ((BYTE *)((long)puVar57 + -1),(U32)local_100,(optState_t *)0x2,iVar53);
      UVar11 = ZSTD_litLengthPrice(UVar16,poVar1,2);
      UVar22 = ZSTD_litLengthPrice(UVar16 - 1,poVar1,2);
      iVar53 = (UVar11 + UVar10 + iVar53) - UVar22;
      if (999999999 < iVar53) {
LAB_0011ff4e:
        __assert_fail("price < 1000000000",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4931,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      iVar24 = pZVar34[uVar42].price;
      iVar23 = (int)uVar42;
      if (iVar24 < iVar53) {
        uVar27 = pZVar41->mlen;
        if (uVar42 < uVar27) {
LAB_0011ff8c:
          __assert_fail("cur >= opt[cur].mlen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4947,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar53 = iVar24;
        if (uVar27 == 0) goto LAB_0011e457;
        rVar63 = ZSTD_updateRep(pZVar34[iVar23 - uVar27].rep,pZVar41->off,
                                (uint)(pZVar41->litlen == 0));
        *&pZVar41->rep = rVar63.rep;
        uVar27 = 1;
        bVar62 = false;
      }
      else {
        pZVar41->off = 0;
        pZVar41->mlen = 0;
        pZVar41->litlen = UVar16;
        pZVar41->price = iVar53;
LAB_0011e457:
        pZVar41->rep[2] = pZVar41[-1].rep[2];
        *(undefined8 *)pZVar41->rep = *(undefined8 *)pZVar41[-1].rep;
        bVar62 = true;
        uVar27 = 0;
      }
      local_130 = &pZVar41->mlen;
      if (puVar3 < puVar57) goto LAB_0011f92f;
      if (uVar42 != uVar55) {
        UVar10 = 0;
        if (bVar62) {
          UVar10 = pZVar41->litlen;
        }
        UVar16 = ZSTD_litLengthPrice(0,local_100,2);
        pBVar60 = (ms->window).base;
        uVar55 = (ulong)ms->nextToUpdate;
        if (puVar57 < pBVar60 + uVar55) goto LAB_0011f92f;
        UVar11 = (ms->cParams).minMatch;
        while( true ) {
          uVar47 = (uint)uVar55;
          uVar12 = (uint)((long)puVar57 - (long)pBVar60);
          if (uVar12 <= uVar47) break;
          UVar22 = ZSTD_insertBt1(ms,pBVar60 + uVar55,pInLimit,UVar11,0);
          uVar55 = (ulong)(UVar22 + uVar47);
          if (UVar22 + uVar47 <= uVar47) goto LAB_0011fd3f;
        }
        if ((ulong)((long)puVar57 - (long)pBVar60) >> 0x20 == 0) {
          if ((ulong)((long)pInLimit - (long)pBVar60) >> 0x20 == 0) {
            ms->nextToUpdate = uVar12;
            uVar55 = (ulong)uVar27;
            iVar24 = (int)puVar57;
            if (UVar11 - 6 < 2) {
              uVar12 = (ms->cParams).targetLength;
              if (0xffe < uVar12) {
                uVar12 = 0xfff;
              }
              local_b8 = (uint *)(ms->window).base;
              uVar47 = iVar24 - (int)local_b8;
              uVar45 = 0;
              local_78 = (ulong)(*(long *)puVar57 * -0x30e4432340650000) >>
                         (-(char)(ms->cParams).hashLog & 0x3fU);
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar24 = uVar47 - uVar54;
              if (uVar47 < uVar54) {
                iVar24 = 0;
              }
              local_108 = (U32 *)CONCAT44(local_108._4_4_,iVar24);
              uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar11 = (ms->window).lowLimit;
              UVar22 = uVar47 - uVar13;
              if (uVar47 - UVar11 <= uVar13) {
                UVar22 = UVar11;
              }
              local_f8 = ms->chainTable;
              uVar13 = (ms->window).dictLimit;
              pBVar60 = (BYTE *)(ulong)uVar13;
              if (ms->loadedDictEnd != 0) {
                UVar22 = UVar11;
              }
              local_f0 = (uint *)CONCAT44(local_f0._4_4_,UVar22 + (UVar22 == 0));
              local_e0 = (U32 *)CONCAT44(local_e0._4_4_,uVar54);
              uVar61 = (ulong)((uVar54 & uVar47) * 2);
              local_120 = local_f8 + uVar61;
              iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_1c0 = (optState_t *)(local_f8 + uVar61 + 1);
              local_60 = ms->hashTable;
              uVar54 = local_60[local_78];
              local_b0 = CONCAT44(local_b0._4_4_,uVar47 + 8);
              uVar15 = uVar47 + 9;
              uVar61 = uVar55 + 3;
              local_90 = puVar57 + 1;
              puVar35 = local_80;
              local_110 = pBVar60;
              for (; uVar55 < uVar61; uVar55 = uVar55 + 1) {
                if (uVar55 == 3) {
                  uVar14 = pZVar41->rep[0] - 1;
                }
                else {
                  uVar14 = local_190[uVar55];
                }
                if (uVar47 < (uint)pBVar60) goto LAB_0011fd5e;
                if (uVar14 - 1 < uVar47 - uVar13) {
                  if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar14)) goto LAB_0011e9ca;
                  sVar28 = ZSTD_count((BYTE *)local_90,(BYTE *)((long)local_90 - (ulong)uVar14),
                                      pInLimit);
                  uVar14 = (int)sVar28 + 4;
                  pBVar60 = local_110;
                }
                else {
                  if (uVar47 < UVar22) goto LAB_0011fd7d;
LAB_0011e9ca:
                  uVar14 = 0;
                }
                puVar29 = (uint *)(ulong)uVar14;
                if (puVar35 < puVar29) {
                  local_e8->rep[uVar45 * 2 + -4] = (int)uVar55 - uVar27;
                  local_e8->rep[uVar45 * 2 + -3] = uVar14;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if ((uVar12 < uVar14) ||
                     (puVar35 = puVar29, (BYTE *)((long)puVar57 + (long)puVar29) == pInLimit))
                  goto LAB_0011f76d;
                }
              }
              local_60[local_78] = uVar47;
              puVar29 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              while( true ) {
                bVar62 = iVar24 == 0;
                iVar24 = iVar24 + -1;
                if ((bVar62) || (uVar54 < (uint)local_f0)) break;
                puVar46 = puVar29;
                if (puVar37 < puVar29) {
                  puVar46 = puVar37;
                }
                if (uVar47 <= uVar54) goto LAB_0011fd9c;
                if ((BYTE *)((ulong)uVar54 + (long)puVar46) < pBVar60) goto LAB_0011fdbb;
                pvVar59 = (void *)((ulong)uVar54 + (long)local_b8);
                if (((uint)pBVar60 <= uVar54) &&
                   (iVar25 = bcmp(pvVar59,puVar57,(size_t)puVar46), iVar25 != 0)) goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar46),
                                    (BYTE *)((long)pvVar59 + (long)puVar46),pInLimit);
                puVar46 = (uint *)(sVar28 + (long)puVar46);
                if (puVar35 < puVar46) {
                  if (uVar15 < uVar54 || uVar15 - uVar54 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar15 - uVar54) < puVar46) {
                    uVar15 = uVar54 + (U32)puVar46;
                  }
                  local_e8->rep[uVar45 * 2 + -4] = (uVar47 + 2) - uVar54;
                  local_e8->rep[uVar45 * 2 + -3] = (U32)puVar46;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if (((uint *)0x1000 < puVar46) ||
                     (puVar35 = puVar46, (BYTE *)((long)puVar57 + (long)puVar46) == pInLimit))
                  break;
                }
                puVar30 = local_f8 + (uVar54 & (uint)local_e0) * 2;
                if (*(byte *)((long)pvVar59 + (long)puVar46) <
                    *(byte *)((long)puVar57 + (long)puVar46)) {
                  *local_120 = uVar54;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f505;
                  puVar30 = puVar30 + 1;
                  puVar37 = puVar46;
                  local_120 = puVar30;
                }
                else {
                  *(uint *)local_1c0 = uVar54;
                  local_1c0 = (optState_t *)puVar30;
                  puVar29 = puVar46;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f4ec;
                }
                uVar54 = *puVar30;
                pBVar60 = local_110;
              }
              goto LAB_0011f519;
            }
            if (UVar11 == 5) {
              uVar12 = (ms->cParams).targetLength;
              if (0xffe < uVar12) {
                uVar12 = 0xfff;
              }
              local_b8 = (uint *)(ms->window).base;
              uVar47 = iVar24 - (int)local_b8;
              uVar45 = 0;
              local_78 = (ulong)(*(long *)puVar57 * -0x30e4432345000000) >>
                         (-(char)(ms->cParams).hashLog & 0x3fU);
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar24 = uVar47 - uVar54;
              if (uVar47 < uVar54) {
                iVar24 = 0;
              }
              local_108 = (U32 *)CONCAT44(local_108._4_4_,iVar24);
              uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar11 = (ms->window).lowLimit;
              UVar22 = uVar47 - uVar13;
              if (uVar47 - UVar11 <= uVar13) {
                UVar22 = UVar11;
              }
              local_f8 = ms->chainTable;
              uVar13 = (ms->window).dictLimit;
              pBVar60 = (BYTE *)(ulong)uVar13;
              if (ms->loadedDictEnd != 0) {
                UVar22 = UVar11;
              }
              local_f0 = (uint *)CONCAT44(local_f0._4_4_,UVar22 + (UVar22 == 0));
              local_e0 = (U32 *)CONCAT44(local_e0._4_4_,uVar54);
              uVar61 = (ulong)((uVar54 & uVar47) * 2);
              local_120 = local_f8 + uVar61;
              iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_1c0 = (optState_t *)(local_f8 + uVar61 + 1);
              local_60 = ms->hashTable;
              uVar54 = local_60[local_78];
              local_b0 = CONCAT44(local_b0._4_4_,uVar47 + 8);
              uVar15 = uVar47 + 9;
              uVar61 = uVar55 + 3;
              local_90 = puVar57 + 1;
              puVar35 = local_80;
              local_110 = pBVar60;
              for (; uVar55 < uVar61; uVar55 = uVar55 + 1) {
                if (uVar55 == 3) {
                  uVar14 = pZVar41->rep[0] - 1;
                }
                else {
                  uVar14 = local_190[uVar55];
                }
                if (uVar47 < (uint)pBVar60) goto LAB_0011fd5e;
                if (uVar14 - 1 < uVar47 - uVar13) {
                  if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar14)) goto LAB_0011edd9;
                  sVar28 = ZSTD_count((BYTE *)local_90,(BYTE *)((long)local_90 - (ulong)uVar14),
                                      pInLimit);
                  uVar14 = (int)sVar28 + 4;
                  pBVar60 = local_110;
                }
                else {
                  if (uVar47 < UVar22) goto LAB_0011fd7d;
LAB_0011edd9:
                  uVar14 = 0;
                }
                puVar29 = (uint *)(ulong)uVar14;
                if (puVar35 < puVar29) {
                  local_e8->rep[uVar45 * 2 + -4] = (int)uVar55 - uVar27;
                  local_e8->rep[uVar45 * 2 + -3] = uVar14;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if ((uVar12 < uVar14) ||
                     (puVar35 = puVar29, (BYTE *)((long)puVar57 + (long)puVar29) == pInLimit))
                  goto LAB_0011f76d;
                }
              }
              local_60[local_78] = uVar47;
              puVar29 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              while( true ) {
                bVar62 = iVar24 == 0;
                iVar24 = iVar24 + -1;
                if ((bVar62) || (uVar54 < (uint)local_f0)) break;
                puVar46 = puVar29;
                if (puVar37 < puVar29) {
                  puVar46 = puVar37;
                }
                if (uVar47 <= uVar54) goto LAB_0011fd9c;
                if ((BYTE *)((ulong)uVar54 + (long)puVar46) < pBVar60) goto LAB_0011fdbb;
                pvVar59 = (void *)((ulong)uVar54 + (long)local_b8);
                if (((uint)pBVar60 <= uVar54) &&
                   (iVar25 = bcmp(pvVar59,puVar57,(size_t)puVar46), iVar25 != 0)) goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar46),
                                    (BYTE *)((long)pvVar59 + (long)puVar46),pInLimit);
                puVar46 = (uint *)(sVar28 + (long)puVar46);
                if (puVar35 < puVar46) {
                  if (uVar15 < uVar54 || uVar15 - uVar54 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar15 - uVar54) < puVar46) {
                    uVar15 = (U32)puVar46 + uVar54;
                  }
                  local_e8->rep[uVar45 * 2 + -4] = (uVar47 + 2) - uVar54;
                  local_e8->rep[uVar45 * 2 + -3] = (U32)puVar46;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if (((uint *)0x1000 < puVar46) ||
                     (puVar35 = puVar46, (BYTE *)((long)puVar57 + (long)puVar46) == pInLimit))
                  break;
                }
                puVar30 = local_f8 + (uVar54 & (uint)local_e0) * 2;
                if (*(byte *)((long)pvVar59 + (long)puVar46) <
                    *(byte *)((long)puVar57 + (long)puVar46)) {
                  *local_120 = uVar54;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f505;
                  puVar30 = puVar30 + 1;
                  puVar37 = puVar46;
                  local_120 = puVar30;
                }
                else {
                  *(uint *)local_1c0 = uVar54;
                  local_1c0 = (optState_t *)puVar30;
                  puVar29 = puVar46;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f4ec;
                }
                uVar54 = *puVar30;
                pBVar60 = local_110;
              }
              goto LAB_0011f519;
            }
            if (UVar11 != 3) {
              uVar12 = (ms->cParams).targetLength;
              if (0xffe < uVar12) {
                uVar12 = 0xfff;
              }
              local_b8 = (uint *)(ms->window).base;
              uVar47 = iVar24 - (int)local_b8;
              uVar45 = 0;
              local_78 = (ulong)(*puVar57 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar54 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar24 = uVar47 - uVar54;
              if (uVar47 < uVar54) {
                iVar24 = 0;
              }
              local_108 = (U32 *)CONCAT44(local_108._4_4_,iVar24);
              uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar11 = (ms->window).lowLimit;
              UVar22 = uVar47 - uVar13;
              if (uVar47 - UVar11 <= uVar13) {
                UVar22 = UVar11;
              }
              local_f8 = ms->chainTable;
              uVar13 = (ms->window).dictLimit;
              pBVar60 = (BYTE *)(ulong)uVar13;
              if (ms->loadedDictEnd != 0) {
                UVar22 = UVar11;
              }
              local_f0 = (uint *)CONCAT44(local_f0._4_4_,UVar22 + (UVar22 == 0));
              local_e0 = (U32 *)CONCAT44(local_e0._4_4_,uVar54);
              uVar61 = (ulong)((uVar54 & uVar47) * 2);
              local_120 = local_f8 + uVar61;
              iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_1c0 = (optState_t *)(local_f8 + uVar61 + 1);
              local_60 = ms->hashTable;
              uVar54 = local_60[local_78];
              local_b0 = CONCAT44(local_b0._4_4_,uVar47 + 8);
              uVar15 = uVar47 + 9;
              uVar61 = uVar55 + 3;
              local_90 = puVar57 + 1;
              puVar35 = local_80;
              local_110 = pBVar60;
              for (; uVar55 < uVar61; uVar55 = uVar55 + 1) {
                if (uVar55 == 3) {
                  uVar14 = pZVar41->rep[0] - 1;
                }
                else {
                  uVar14 = local_190[uVar55];
                }
                if (uVar47 < (uint)pBVar60) goto LAB_0011fd5e;
                if (uVar14 - 1 < uVar47 - uVar13) {
                  if (*puVar57 != *(uint *)((long)puVar57 - (ulong)uVar14)) goto LAB_0011f01e;
                  sVar28 = ZSTD_count((BYTE *)local_90,(BYTE *)((long)local_90 - (ulong)uVar14),
                                      pInLimit);
                  uVar14 = (int)sVar28 + 4;
                  pBVar60 = local_110;
                }
                else {
                  if (uVar47 < UVar22) goto LAB_0011fd7d;
LAB_0011f01e:
                  uVar14 = 0;
                }
                puVar29 = (uint *)(ulong)uVar14;
                if (puVar35 < puVar29) {
                  local_e8->rep[uVar45 * 2 + -4] = (int)uVar55 - uVar27;
                  local_e8->rep[uVar45 * 2 + -3] = uVar14;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if ((uVar12 < uVar14) ||
                     (puVar35 = puVar29, (BYTE *)((long)puVar57 + (long)puVar29) == pInLimit))
                  goto LAB_0011f76d;
                }
              }
              local_60[local_78] = uVar47;
              puVar29 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              while( true ) {
                bVar62 = iVar24 == 0;
                iVar24 = iVar24 + -1;
                if ((bVar62) || (uVar54 < (uint)local_f0)) break;
                puVar46 = puVar29;
                if (puVar37 < puVar29) {
                  puVar46 = puVar37;
                }
                if (uVar47 <= uVar54) goto LAB_0011fd9c;
                if ((BYTE *)((ulong)uVar54 + (long)puVar46) < pBVar60) goto LAB_0011fdbb;
                pvVar59 = (void *)((ulong)uVar54 + (long)local_b8);
                if (((uint)pBVar60 <= uVar54) &&
                   (iVar25 = bcmp(pvVar59,puVar57,(size_t)puVar46), iVar25 != 0)) goto LAB_0011fdda;
                sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar46),
                                    (BYTE *)((long)pvVar59 + (long)puVar46),pInLimit);
                puVar46 = (uint *)(sVar28 + (long)puVar46);
                if (puVar35 < puVar46) {
                  if (uVar15 < uVar54 || uVar15 - uVar54 == 0) goto LAB_0011fdf9;
                  if ((uint *)(ulong)(uVar15 - uVar54) < puVar46) {
                    uVar15 = (U32)puVar46 + uVar54;
                  }
                  local_e8->rep[uVar45 * 2 + -4] = (uVar47 + 2) - uVar54;
                  local_e8->rep[uVar45 * 2 + -3] = (U32)puVar46;
                  uVar45 = (ulong)((int)uVar45 + 1);
                  if (((uint *)0x1000 < puVar46) ||
                     (puVar35 = puVar46, (BYTE *)((long)puVar57 + (long)puVar46) == pInLimit))
                  break;
                }
                puVar30 = local_f8 + (uVar54 & (uint)local_e0) * 2;
                if (*(byte *)((long)pvVar59 + (long)puVar46) <
                    *(byte *)((long)puVar57 + (long)puVar46)) {
                  *local_120 = uVar54;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f505;
                  puVar30 = puVar30 + 1;
                  puVar37 = puVar46;
                  local_120 = puVar30;
                }
                else {
                  *(uint *)local_1c0 = uVar54;
                  local_1c0 = (optState_t *)puVar30;
                  puVar29 = puVar46;
                  if (uVar54 <= (uint)local_108) goto LAB_0011f4ec;
                }
                uVar54 = *puVar30;
                pBVar60 = local_110;
              }
              goto LAB_0011f519;
            }
            uVar12 = (ms->cParams).targetLength;
            if (0xffe < uVar12) {
              uVar12 = 0xfff;
            }
            pBVar60 = (ms->window).base;
            uVar54 = iVar24 - (int)pBVar60;
            uVar45 = 0;
            local_78 = (ulong)(*puVar57 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar47 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar24 = uVar54 - uVar47;
            if (uVar54 < uVar47) {
              iVar24 = 0;
            }
            local_f0 = (uint *)CONCAT44(local_f0._4_4_,iVar24);
            uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar13 = (ms->window).lowLimit;
            uVar15 = uVar54 - uVar14;
            if (uVar54 - uVar13 <= uVar14) {
              uVar15 = uVar13;
            }
            local_e0 = ms->chainTable;
            uVar14 = (ms->window).dictLimit;
            pBVar58 = (BYTE *)(ulong)uVar14;
            if (ms->loadedDictEnd != 0) {
              uVar15 = uVar13;
            }
            uVar13 = uVar15 + (uVar15 == 0);
            local_b8 = (uint *)CONCAT44(local_b8._4_4_,uVar47);
            uVar61 = (ulong)((uVar47 & uVar54) * 2);
            local_138 = local_e0 + uVar61;
            iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_1c0 = (optState_t *)(local_e0 + uVar61 + 1);
            pUVar44 = (U32 *)(ulong)-uVar27;
            local_60 = ms->hashTable;
            local_90 = (uint *)(ulong)local_60[local_78];
            local_b0 = CONCAT44(local_b0._4_4_,uVar54 + 8);
            uVar27 = uVar54 + 9;
            uVar61 = uVar55 + 3;
            local_f8 = (U32 *)((long)puVar57 + 3);
            puVar35 = local_80;
            local_110 = pBVar58;
            local_108 = pUVar44;
            for (; uVar55 < uVar61; uVar55 = uVar55 + 1) {
              if (uVar55 == 3) {
                uVar47 = pZVar41->rep[0] - 1;
              }
              else {
                uVar47 = local_190[uVar55];
              }
              if (uVar54 < (uint)pBVar58) goto LAB_0011fd5e;
              if (uVar47 - 1 < uVar54 - uVar14) {
                if (((*(uint *)((long)puVar57 - (ulong)uVar47) ^ *puVar57) & 0xffffff) != 0)
                goto LAB_0011e775;
                sVar28 = ZSTD_count((BYTE *)local_f8,(BYTE *)((long)local_f8 - (ulong)uVar47),
                                    pInLimit);
                uVar47 = (int)sVar28 + 3;
                pUVar44 = local_108;
                pBVar58 = local_110;
              }
              else {
                if (uVar54 < uVar15) goto LAB_0011fd7d;
LAB_0011e775:
                uVar47 = 0;
              }
              puVar29 = (uint *)(ulong)uVar47;
              if (puVar35 < puVar29) {
                local_e8->rep[uVar45 * 2 + -4] = (int)pUVar44 + (int)uVar55;
                local_e8->rep[uVar45 * 2 + -3] = uVar47;
                uVar45 = (ulong)((int)uVar45 + 1);
                if ((uVar12 < uVar47) ||
                   (puVar35 = puVar29, (BYTE *)((long)puVar57 + (long)puVar29) == pInLimit))
                goto LAB_0011f76d;
              }
            }
            if ((((puVar35 < (uint *)0x3) &&
                 (UVar11 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3_1,(BYTE *)puVar57),
                 pBVar58 = local_110, uVar13 <= UVar11)) && (uVar54 - UVar11 < 0x40000)) &&
               (puVar29 = (uint *)ZSTD_count((BYTE *)puVar57,pBVar60 + UVar11,pInLimit),
               pBVar58 = local_110, (uint *)0x2 < puVar29)) {
              if (uVar54 <= UVar11) goto LAB_00120046;
              if ((int)uVar45 != 0) goto LAB_00120065;
              local_e8->price = (uVar54 - UVar11) + 2;
              local_e8->off = (U32)puVar29;
              uVar45 = 1;
              puVar35 = puVar29;
              if (puVar29 <= (uint *)(ulong)uVar12 &&
                  (BYTE *)((long)puVar29 + (long)puVar57) != pInLimit) goto LAB_0011f560;
              UVar11 = uVar54 + 1;
              uVar45 = 1;
            }
            else {
LAB_0011f560:
              local_60[local_78] = uVar54;
              local_108 = (U32 *)CONCAT44(local_108._4_4_,uVar54 + 2);
              puVar29 = (uint *)0x0;
              puVar37 = (uint *)0x0;
              puVar46 = local_90;
LAB_0011f583:
              bVar62 = iVar24 == 0;
              iVar24 = iVar24 + -1;
              if ((bVar62) || (uVar12 = (uint)puVar46, uVar12 < uVar13)) goto LAB_0011f748;
              puVar30 = puVar29;
              if (puVar37 < puVar29) {
                puVar30 = puVar37;
              }
              if (uVar54 <= uVar12) goto LAB_0011fd9c;
              if ((BYTE *)(((ulong)puVar46 & 0xffffffff) + (long)puVar30) < pBVar58)
              goto LAB_0011fdbb;
              __s1 = pBVar60 + ((ulong)puVar46 & 0xffffffff);
              if (((uint)pBVar58 <= uVar12) &&
                 (iVar25 = bcmp(__s1,puVar57,(size_t)puVar30), iVar25 != 0)) goto LAB_0011fdda;
              sVar28 = ZSTD_count((BYTE *)((long)puVar57 + (long)puVar30),__s1 + (long)puVar30,
                                  pInLimit);
              puVar30 = (uint *)(sVar28 + (long)puVar30);
              if (puVar35 < puVar30) {
                if (uVar27 < uVar12 || uVar27 - uVar12 == 0) goto LAB_0011fdf9;
                if ((uint *)(ulong)(uVar27 - uVar12) < puVar30) {
                  uVar27 = uVar12 + (U32)puVar30;
                }
                local_e8->rep[uVar45 * 2 + -4] = (uint)local_108 - uVar12;
                local_e8->rep[uVar45 * 2 + -3] = (U32)puVar30;
                uVar45 = (ulong)((int)uVar45 + 1);
                if (((uint *)0x1000 < puVar30) ||
                   (puVar35 = puVar30, (BYTE *)((long)puVar57 + (long)puVar30) == pInLimit))
                goto LAB_0011f748;
              }
              puVar46 = local_e0 + (uVar12 & (uint)local_b8) * 2;
              if (*(byte *)((long)puVar57 + (long)puVar30) <= __s1[(long)puVar30]) {
                *(uint *)local_1c0 = uVar12;
                local_1c0 = (optState_t *)puVar46;
                puVar29 = puVar30;
                if (uVar12 <= (uint)local_f0) {
                  local_1c0 = (optState_t *)local_c8;
                  goto LAB_0011f748;
                }
LAB_0011f707:
                puVar46 = (uint *)(ulong)*puVar46;
                pBVar58 = local_110;
                goto LAB_0011f583;
              }
              *local_138 = uVar12;
              if ((uint)local_f0 < uVar12) {
                puVar46 = puVar46 + 1;
                puVar37 = puVar30;
                local_138 = puVar46;
                goto LAB_0011f707;
              }
              local_138 = local_c8;
LAB_0011f748:
              *(uint *)local_1c0 = 0;
              *local_138 = 0;
              if (uVar27 <= (uint)local_b0) goto LAB_0011fe56;
              UVar11 = uVar27 - 8;
            }
            ms->nextToUpdate = UVar11;
            goto LAB_0011f76d;
          }
          goto LAB_0011fe37;
        }
        goto LAB_0011fe18;
      }
    }
    local_68 = (U32 *)CONCAT44(local_68._4_4_,pZVar34[uVar55].price);
    UVar11 = pZVar34[uVar55].off;
    uVar27 = pZVar34[uVar55].mlen;
    UVar10 = pZVar34[uVar55].litlen;
    local_40 = pZVar34[uVar55].rep[2];
    local_48 = *(undefined8 *)pZVar34[uVar55].rep;
    uVar12 = (uint)uVar39 - (UVar10 + uVar27);
    uVar42 = (ulong)uVar12;
    if (UVar10 + uVar27 <= (uint)uVar39 && uVar12 != 0) {
      if (0xfff < uVar12) {
LAB_00120084:
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4995,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      goto LAB_0011f9a1;
    }
  }
  uVar42 = 0;
LAB_0011f9a1:
  if (pZVar34->mlen != 0) {
LAB_00120008:
    __assert_fail("opt[0].mlen == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4998,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  if (uVar27 == 0) {
    (*local_88)[2] = pZVar34[uVar42].rep[2];
    *(undefined8 *)*local_88 = *(undefined8 *)pZVar34[uVar42].rep;
  }
  else {
    rVar63 = ZSTD_updateRep(pZVar34[uVar42].rep,UVar11,(uint)(UVar10 == 0));
    *local_88 = rVar63.rep;
  }
  uVar12 = (int)uVar42 + 1;
  if (0xfff < uVar12) {
LAB_00120027:
    __assert_fail("storeEnd < ZSTD_OPT_NUM",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x49ab,
                  "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                 );
  }
  uVar55 = (ulong)uVar12;
  pZVar34[uVar55].price = (int)local_68;
  pZVar34[uVar55].off = UVar11;
  pZVar34[uVar55].mlen = uVar27;
  pZVar34[uVar55].litlen = UVar10;
  *(undefined8 *)pZVar34[uVar55].rep = local_48;
  pZVar34[uVar55].rep[2] = local_40;
  uVar39 = uVar42;
  while( true ) {
    uVar27 = (uint)uVar42;
    if (uVar27 == 0) break;
    uVar12 = pZVar34[uVar42].litlen + pZVar34[uVar42].mlen;
    pZVar41 = pZVar34 + uVar42;
    iVar53 = pZVar41->price;
    UVar10 = pZVar41->off;
    UVar11 = pZVar41->mlen;
    UVar22 = pZVar41->litlen;
    pZVar41 = pZVar34 + uVar42;
    UVar16 = pZVar41->rep[0];
    uVar8 = *(undefined8 *)(&pZVar41->litlen + 2);
    pZVar9 = pZVar34 + uVar39;
    pZVar9->litlen = pZVar41->litlen;
    pZVar9->rep[0] = UVar16;
    *(undefined8 *)(&pZVar9->litlen + 2) = uVar8;
    pZVar41 = pZVar34 + uVar39;
    pZVar41->price = iVar53;
    pZVar41->off = UVar10;
    pZVar41->mlen = UVar11;
    pZVar41->litlen = UVar22;
    uVar42 = (ulong)(uVar27 - uVar12);
    if (uVar27 < uVar12) {
      uVar42 = 0;
    }
    uVar39 = (ulong)((int)uVar39 - 1);
  }
  puVar57 = local_58;
  for (uVar42 = (ulong)((int)uVar39 + 1); uVar42 <= uVar55; uVar42 = uVar42 + 1) {
    uVar27 = pZVar34[uVar42].litlen;
    uVar39 = (ulong)uVar27;
    UVar16 = pZVar34[uVar42].mlen;
    if (UVar16 == 0) {
      if (uVar42 != uVar55) {
LAB_0011fef1:
        __assert_fail("storePos == storeEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x49c4,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      puVar51 = (uint *)(uVar39 + (long)puVar57);
    }
    else {
      pBVar60 = (BYTE *)((long)puVar57 + uVar39);
      if (pInLimit < pBVar60) {
LAB_0011fed2:
        __assert_fail("anchor + llen <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x49c9,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      UVar10 = pZVar34[uVar42].off;
      ZSTD_updateStats(local_100,uVar27,(BYTE *)puVar57,UVar10,UVar16);
      if (local_d8->maxNbSeq <=
          (ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3)) {
LAB_0011fe75:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_d8->maxNbLit) {
LAB_0011fe94:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar58 = local_d8->lit;
      if (local_d8->litStart + local_d8->maxNbLit < pBVar58 + uVar39) {
LAB_0011feb3:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_d0 < pBVar60) {
        ZSTD_safecopyLiterals(pBVar58,(BYTE *)puVar57,pBVar60,local_d0);
LAB_0011fb65:
        local_d8->lit = local_d8->lit + uVar39;
        if (0xffff < uVar27) {
          if (local_d8->longLengthID != 0) {
LAB_0011ff6d:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_d8->longLengthID = 1;
          local_d8->longLengthPos =
               (U32)((ulong)((long)local_d8->sequences - (long)local_d8->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = *(undefined8 *)(puVar57 + 2);
        *(undefined8 *)pBVar58 = *(undefined8 *)puVar57;
        *(undefined8 *)(pBVar58 + 8) = uVar8;
        if (0x10 < uVar27) {
          pBVar60 = local_d8->lit;
          lVar33 = (long)(pBVar60 + 0x10) - (long)(puVar57 + 4);
          if (lVar33 < 8) {
            if (-0x10 < lVar33) {
LAB_0011ffca:
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
          }
          else if (0xffffffffffffffe0 < lVar33 - 0x10U) {
LAB_0011ffab:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar8 = *(undefined8 *)(puVar57 + 6);
          *(undefined8 *)(pBVar60 + 0x10) = *(undefined8 *)(puVar57 + 4);
          *(undefined8 *)(pBVar60 + 0x18) = uVar8;
          if (uVar39 - 0x21 < 0xffffffffffffffef) {
            lVar33 = 0;
            do {
              puVar4 = (undefined8 *)((long)puVar57 + lVar33 + 0x20);
              uVar8 = puVar4[1];
              pBVar58 = pBVar60 + lVar33 + 0x20;
              *(undefined8 *)pBVar58 = *puVar4;
              *(undefined8 *)(pBVar58 + 8) = uVar8;
              puVar4 = (undefined8 *)((long)puVar57 + lVar33 + 0x30);
              uVar8 = puVar4[1];
              *(undefined8 *)(pBVar58 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar58 + 0x18) = uVar8;
              lVar33 = lVar33 + 0x20;
            } while (pBVar58 + 0x20 < pBVar60 + uVar39);
            goto LAB_0011fb65;
          }
        }
        local_d8->lit = local_d8->lit + uVar39;
      }
      psVar7 = local_d8->sequences;
      psVar7->litLength = (U16)uVar27;
      psVar7->offset = UVar10 + 1;
      if (0xffff < UVar16 - 3) {
        if (local_d8->longLengthID != 0) {
LAB_0011ff10:
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d8->longLengthID = 2;
        local_d8->longLengthPos = (U32)((ulong)((long)psVar7 - (long)local_d8->sequencesStart) >> 3)
        ;
      }
      psVar7->matchLength = (U16)(UVar16 - 3);
      local_d8->sequences = psVar7 + 1;
      puVar51 = (uint *)((long)puVar57 + (ulong)(UVar16 + uVar27));
      puVar57 = puVar51;
    }
  }
  ZSTD_setBasePrices(local_100,2);
  local_58 = puVar57;
  goto LAB_0011ced2;
LAB_0011f4ec:
  local_1c0 = (optState_t *)local_c8;
  goto LAB_0011f519;
LAB_0011f505:
  local_120 = local_c8;
LAB_0011f519:
  *(uint *)local_1c0 = 0;
  *local_120 = 0;
  if (uVar15 <= (uint)local_b0) goto LAB_0011fe56;
  ms->nextToUpdate = uVar15 - 8;
LAB_0011f76d:
  if ((int)uVar45 != 0) {
    uVar55 = (ulong)((int)uVar45 - 1);
    uVar27 = local_e8->rep[uVar55 * 2 + -3];
    if (((uint)local_70 < uVar27) || (0xfff < uVar27 + iVar23)) {
      UVar16 = 0;
      if (*local_130 == 0) {
        UVar16 = pZVar41->litlen;
      }
      UVar11 = local_e8->rep[uVar55 * 2 + -4];
      uVar12 = iVar23 - UVar16;
      if (0x1000 < iVar23 - UVar16) {
        uVar12 = 0;
      }
      uVar42 = (ulong)uVar12;
      goto LAB_0011f9a1;
    }
    for (uVar55 = 0; uVar55 != uVar45; uVar55 = uVar55 + 1) {
      local_1b0 = (uint *)local_38;
      if (uVar55 != 0) {
        local_1b0 = (uint *)(ulong)(local_e8->rep[uVar55 * 2 + -5] + 1);
      }
      UVar11 = local_e8->rep[uVar55 * 2 + -4];
      for (uVar61 = (ulong)local_e8->rep[uVar55 * 2 + -3]; local_1b0 <= uVar61; uVar61 = uVar61 - 1)
      {
        UVar22 = ZSTD_highbit32(UVar11 + 1);
        if (uVar61 < 3) goto LAB_0011fd20;
        UVar17 = (U32)uVar61;
        if ((ms->opt).priceType == zop_predef) {
          UVar18 = ZSTD_fracWeight(UVar17 - 3);
          iVar24 = UVar18 + UVar22 * 0x100 + 0x1000;
        }
        else {
          UVar18 = (ms->opt).offCodeSumBasePrice;
          UVar19 = ZSTD_fracWeight((ms->opt).offCodeFreq[UVar22]);
          UVar20 = ZSTD_MLcode(UVar17 - 3);
          UVar5 = (ms->opt).matchLengthSumBasePrice;
          UVar21 = ZSTD_fracWeight(*(U32 *)((long)(ms->opt).matchLengthFreq + (ulong)(UVar20 << 2)))
          ;
          iVar24 = (((*(int *)((long)ML_bits + (ulong)(UVar20 << 2)) + UVar22) * 0x100 +
                    (UVar18 - UVar19) + UVar5) - UVar21) + 0x33;
        }
        iVar24 = iVar24 + UVar16 + iVar53;
        uVar50 = (ulong)(UVar17 + iVar23);
        if (((uint)uVar39 < UVar17 + iVar23) || (iVar24 < pZVar34[uVar50].price)) {
          uVar39 = uVar39 & 0xffffffff;
          pZVar41 = local_a8 + uVar39;
          for (; uVar39 < uVar50; uVar39 = uVar39 + 1) {
            pZVar41->price = 0x40000000;
            pZVar41 = pZVar41 + 1;
          }
          pZVar34[uVar50].mlen = UVar17;
          pZVar34[uVar50].off = UVar11;
          pZVar34[uVar50].litlen = UVar10;
          pZVar34[uVar50].price = iVar24;
        }
      }
    }
  }
LAB_0011f92f:
  uVar42 = uVar42 + 1;
  local_190 = local_190 + 7;
  goto LAB_0011e319;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}